

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  ulong uVar64;
  long lVar65;
  long lVar66;
  ulong uVar67;
  bool bVar68;
  ulong uVar69;
  undefined1 auVar70 [8];
  undefined8 unaff_R13;
  ulong uVar71;
  Geometry *geometry;
  long lVar72;
  byte bVar73;
  float fVar74;
  float fVar133;
  float fVar135;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar75;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar139;
  float fVar140;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined4 uVar141;
  vint4 bi_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  float fVar148;
  undefined8 uVar149;
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar175;
  float fVar177;
  vint4 ai_1;
  undefined1 auVar176 [16];
  undefined1 auVar178 [32];
  float fVar179;
  uint uVar180;
  float fVar182;
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_880;
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [32];
  LinearSpace3fa *local_7f0;
  Primitive *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [64];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar64 = (ulong)(byte)prim[1];
  lVar65 = uVar64 * 0x25;
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x11 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  uVar141 = *(undefined4 *)(prim + lVar65 + 0x12);
  auVar193._4_4_ = uVar141;
  auVar193._0_4_ = uVar141;
  auVar193._8_4_ = uVar141;
  auVar193._12_4_ = uVar141;
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar76 = vsubps_avx512vl(auVar88,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar160 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar65 + 0x16)) *
            *(float *)(prim + lVar65 + 0x1a);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar88);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar31 = vpmovsxwd_avx(auVar93);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar142 = vpmovsxwd_avx(auVar90);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar151 = vpmovsxwd_avx(auVar89);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar88 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar88 = vinsertps_avx512f(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vmulps_avx512vl(auVar193,auVar76);
  auVar77 = vmulps_avx512vl(auVar193,auVar88);
  auVar78 = vcvtdq2ps_avx512vl(auVar29);
  auVar79 = vcvtdq2ps_avx512vl(auVar84);
  auVar80 = vcvtdq2ps_avx512vl(auVar80);
  auVar81 = vcvtdq2ps_avx512vl(auVar81);
  auVar82 = vcvtdq2ps_avx512vl(auVar82);
  auVar88 = vcvtdq2ps_avx(auVar83);
  auVar93 = vcvtdq2ps_avx(auVar85);
  auVar90 = vcvtdq2ps_avx(auVar86);
  auVar89 = vcvtdq2ps_avx(auVar87);
  uVar141 = auVar77._0_4_;
  auVar165._4_4_ = uVar141;
  auVar165._0_4_ = uVar141;
  auVar165._8_4_ = uVar141;
  auVar165._12_4_ = uVar141;
  auVar29 = vshufps_avx(auVar77,auVar77,0x55);
  auVar84 = vshufps_avx(auVar77,auVar77,0xaa);
  auVar83 = vmulps_avx512vl(auVar84,auVar80);
  auVar150._0_4_ = auVar84._0_4_ * auVar88._0_4_;
  auVar150._4_4_ = auVar84._4_4_ * auVar88._4_4_;
  auVar150._8_4_ = auVar84._8_4_ * auVar88._8_4_;
  auVar150._12_4_ = auVar84._12_4_ * auVar88._12_4_;
  auVar77._0_4_ = auVar89._0_4_ * auVar84._0_4_;
  auVar77._4_4_ = auVar89._4_4_ * auVar84._4_4_;
  auVar77._8_4_ = auVar89._8_4_ * auVar84._8_4_;
  auVar77._12_4_ = auVar89._12_4_ * auVar84._12_4_;
  auVar84 = vfmadd231ps_avx512vl(auVar83,auVar29,auVar79);
  auVar83 = vfmadd231ps_avx512vl(auVar150,auVar29,auVar82);
  auVar29 = vfmadd231ps_fma(auVar77,auVar90,auVar29);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar165,auVar78);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar165,auVar81);
  auVar29 = vfmadd231ps_fma(auVar29,auVar93,auVar165);
  auVar85 = vbroadcastss_avx512vl(auVar76);
  auVar86 = vshufps_avx512vl(auVar76,auVar76,0x55);
  auVar87 = vshufps_avx512vl(auVar76,auVar76,0xaa);
  auVar80 = vmulps_avx512vl(auVar87,auVar80);
  auVar88 = vmulps_avx512vl(auVar87,auVar88);
  auVar89 = vmulps_avx512vl(auVar87,auVar89);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar86,auVar79);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar82);
  auVar90 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar90);
  auVar77 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar78);
  auVar78 = vfmadd231ps_avx512vl(auVar88,auVar85,auVar81);
  auVar76 = vfmadd231ps_fma(auVar90,auVar85,auVar93);
  auVar191._8_4_ = 0x7fffffff;
  auVar191._0_8_ = 0x7fffffff7fffffff;
  auVar191._12_4_ = 0x7fffffff;
  auVar88 = vandps_avx(auVar191,auVar84);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar88,auVar189,1);
  bVar68 = (bool)((byte)uVar71 & 1);
  auVar79._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._0_4_;
  bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._4_4_;
  bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._8_4_;
  bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar84._12_4_;
  auVar88 = vandps_avx(auVar191,auVar83);
  uVar71 = vcmpps_avx512vl(auVar88,auVar189,1);
  bVar68 = (bool)((byte)uVar71 & 1);
  auVar91._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar83._0_4_;
  bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar83._4_4_;
  bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar83._8_4_;
  bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar83._12_4_;
  auVar88 = vandps_avx(auVar191,auVar29);
  uVar71 = vcmpps_avx512vl(auVar88,auVar189,1);
  bVar68 = (bool)((byte)uVar71 & 1);
  auVar92._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar29._0_4_;
  bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar29._4_4_;
  bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar29._8_4_;
  bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar29._12_4_;
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar93 = vrcp14ps_avx512vl(auVar79);
  auVar88 = vfnmadd213ps_fma(auVar79,auVar93,auVar186);
  auVar90 = vfmadd132ps_fma(auVar88,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar88 = vfnmadd213ps_fma(auVar91,auVar93,auVar186);
  auVar89 = vfmadd132ps_fma(auVar88,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar92);
  auVar88 = vfnmadd213ps_fma(auVar92,auVar93,auVar186);
  auVar86 = vfmadd132ps_fma(auVar88,auVar93,auVar93);
  auVar170._4_4_ = fVar160;
  auVar170._0_4_ = fVar160;
  auVar170._8_4_ = fVar160;
  auVar170._12_4_ = fVar160;
  auVar88 = vcvtdq2ps_avx(auVar30);
  auVar93 = vcvtdq2ps_avx(auVar31);
  auVar93 = vsubps_avx(auVar93,auVar88);
  auVar87 = vfmadd213ps_fma(auVar93,auVar170,auVar88);
  auVar88 = vcvtdq2ps_avx(auVar142);
  auVar93 = vcvtdq2ps_avx(auVar151);
  auVar93 = vsubps_avx(auVar93,auVar88);
  auVar30 = vfmadd213ps_fma(auVar93,auVar170,auVar88);
  auVar88 = vcvtdq2ps_avx(auVar6);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar64 * 0x16 + 6);
  auVar93 = vpmovsxwd_avx(auVar29);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar88);
  auVar6 = vfmadd213ps_fma(auVar93,auVar170,auVar88);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar64 * 0x14 + 6);
  auVar88 = vpmovsxwd_avx(auVar84);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar93 = vpmovsxwd_avx(auVar80);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar88);
  auVar29 = vfmadd213ps_fma(auVar93,auVar170,auVar88);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar88 = vpmovsxwd_avx(auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar64 * 0x21 + 6);
  auVar93 = vpmovsxwd_avx(auVar82);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar88);
  auVar84 = vfmadd213ps_fma(auVar93,auVar170,auVar88);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar64 * 0x1f + 6);
  auVar88 = vpmovsxwd_avx(auVar83);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar93 = vpmovsxwd_avx(auVar85);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar88);
  auVar93 = vfmadd213ps_fma(auVar93,auVar170,auVar88);
  auVar88 = vsubps_avx(auVar87,auVar77);
  auVar171._0_4_ = auVar90._0_4_ * auVar88._0_4_;
  auVar171._4_4_ = auVar90._4_4_ * auVar88._4_4_;
  auVar171._8_4_ = auVar90._8_4_ * auVar88._8_4_;
  auVar171._12_4_ = auVar90._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar30,auVar77);
  auVar156._0_4_ = auVar90._0_4_ * auVar88._0_4_;
  auVar156._4_4_ = auVar90._4_4_ * auVar88._4_4_;
  auVar156._8_4_ = auVar90._8_4_ * auVar88._8_4_;
  auVar156._12_4_ = auVar90._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar6,auVar78);
  auVar176._0_4_ = auVar89._0_4_ * auVar88._0_4_;
  auVar176._4_4_ = auVar89._4_4_ * auVar88._4_4_;
  auVar176._8_4_ = auVar89._8_4_ * auVar88._8_4_;
  auVar176._12_4_ = auVar89._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar29,auVar78);
  auVar151._0_4_ = auVar89._0_4_ * auVar88._0_4_;
  auVar151._4_4_ = auVar89._4_4_ * auVar88._4_4_;
  auVar151._8_4_ = auVar89._8_4_ * auVar88._8_4_;
  auVar151._12_4_ = auVar89._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar84,auVar76);
  auVar78._0_4_ = auVar86._0_4_ * auVar88._0_4_;
  auVar78._4_4_ = auVar86._4_4_ * auVar88._4_4_;
  auVar78._8_4_ = auVar86._8_4_ * auVar88._8_4_;
  auVar78._12_4_ = auVar86._12_4_ * auVar88._12_4_;
  auVar88 = vsubps_avx(auVar93,auVar76);
  auVar142._0_4_ = auVar86._0_4_ * auVar88._0_4_;
  auVar142._4_4_ = auVar86._4_4_ * auVar88._4_4_;
  auVar142._8_4_ = auVar86._8_4_ * auVar88._8_4_;
  auVar142._12_4_ = auVar86._12_4_ * auVar88._12_4_;
  auVar88 = vpminsd_avx(auVar171,auVar156);
  auVar93 = vpminsd_avx(auVar176,auVar151);
  auVar88 = vmaxps_avx(auVar88,auVar93);
  auVar93 = vpminsd_avx(auVar78,auVar142);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar86._4_4_ = uVar141;
  auVar86._0_4_ = uVar141;
  auVar86._8_4_ = uVar141;
  auVar86._12_4_ = uVar141;
  auVar93 = vmaxps_avx512vl(auVar93,auVar86);
  auVar88 = vmaxps_avx(auVar88,auVar93);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  local_5f0 = vmulps_avx512vl(auVar88,auVar87);
  auVar88 = vpmaxsd_avx(auVar171,auVar156);
  auVar93 = vpmaxsd_avx(auVar176,auVar151);
  auVar88 = vminps_avx(auVar88,auVar93);
  auVar93 = vpmaxsd_avx(auVar78,auVar142);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar30._4_4_ = uVar141;
  auVar30._0_4_ = uVar141;
  auVar30._8_4_ = uVar141;
  auVar30._12_4_ = uVar141;
  auVar93 = vminps_avx512vl(auVar93,auVar30);
  auVar88 = vminps_avx(auVar88,auVar93);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar31);
  auVar93 = vpbroadcastd_avx512vl();
  uVar149 = vcmpps_avx512vl(local_5f0,auVar88,2);
  uVar32 = vpcmpgtd_avx512vl(auVar93,_DAT_01f4ad30);
  uVar71 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar149 & 0xf & (byte)uVar32));
  local_7f0 = pre->ray_space + k;
  auVar147 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar147);
  local_7e8 = prim;
  for (; uVar71 != 0; uVar71 = (ulong)((uint)uVar71 & (uint)uVar71 + 0xf & (uint)uVar149)) {
    lVar65 = 0;
    for (uVar64 = uVar71; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
      lVar65 = lVar65 + 1;
    }
    uVar7 = *(uint *)(local_7e8 + 2);
    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
    uVar64 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             (ulong)*(uint *)(local_7e8 + lVar65 * 4 + 6) *
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar160 = (pGVar9->time_range).lower;
    fVar160 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x1c0) - fVar160) / ((pGVar9->time_range).upper - fVar160))
    ;
    auVar88 = vroundss_avx(ZEXT416((uint)fVar160),ZEXT416((uint)fVar160),9);
    auVar88 = vminss_avx(auVar88,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
    auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
    fVar160 = fVar160 - auVar88._0_4_;
    fVar179 = 1.0 - fVar160;
    _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar66 = (long)(int)auVar88._0_4_ * 0x38;
    lVar72 = *(long *)(_Var10 + 0x10 + lVar66);
    lVar11 = *(long *)(_Var10 + 0x38 + lVar66);
    lVar12 = *(long *)(_Var10 + 0x48 + lVar66);
    auVar76._4_4_ = fVar160;
    auVar76._0_4_ = fVar160;
    auVar76._8_4_ = fVar160;
    auVar76._12_4_ = fVar160;
    pfVar3 = (float *)(lVar11 + lVar12 * uVar64);
    auVar187._0_4_ = fVar160 * *pfVar3;
    auVar187._4_4_ = fVar160 * pfVar3[1];
    auVar187._8_4_ = fVar160 * pfVar3[2];
    auVar187._12_4_ = fVar160 * pfVar3[3];
    lVar65 = uVar64 + 1;
    auVar88 = vmulps_avx512vl(auVar76,*(undefined1 (*) [16])(lVar11 + lVar12 * lVar65));
    p_Var13 = pGVar9[4].occlusionFilterN;
    auVar152._4_4_ = fVar179;
    auVar152._0_4_ = fVar179;
    auVar152._8_4_ = fVar179;
    auVar152._12_4_ = fVar179;
    local_830 = vfmadd231ps_fma(auVar187,auVar152,
                                *(undefined1 (*) [16])(*(long *)(_Var10 + lVar66) + lVar72 * uVar64)
                               );
    _local_690 = vfmadd231ps_avx512vl
                           (auVar88,auVar152,
                            *(undefined1 (*) [16])(*(long *)(_Var10 + lVar66) + lVar72 * lVar65));
    pfVar3 = (float *)(*(long *)(p_Var13 + lVar66 + 0x38) +
                      uVar64 * *(long *)(p_Var13 + lVar66 + 0x48));
    auVar188._0_4_ = fVar160 * *pfVar3;
    auVar188._4_4_ = fVar160 * pfVar3[1];
    auVar188._8_4_ = fVar160 * pfVar3[2];
    auVar188._12_4_ = fVar160 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var13 + lVar66 + 0x38) +
                      *(long *)(p_Var13 + lVar66 + 0x48) * lVar65);
    auVar192._0_4_ = fVar160 * *pfVar3;
    auVar192._4_4_ = fVar160 * pfVar3[1];
    auVar192._8_4_ = fVar160 * pfVar3[2];
    auVar192._12_4_ = fVar160 * pfVar3[3];
    auVar93 = vfmadd231ps_fma(auVar188,auVar152,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var13 + lVar66) +
                               *(long *)(p_Var13 + lVar66 + 0x10) * uVar64));
    auVar90 = vfmadd231ps_fma(auVar192,auVar152,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var13 + lVar66) +
                               *(long *)(p_Var13 + lVar66 + 0x10) * lVar65));
    iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar153._8_4_ = 0xbeaaaaab;
    auVar153._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar153._12_4_ = 0xbeaaaaab;
    local_840 = vfnmadd213ps_fma(auVar93,auVar153,local_830);
    local_850 = vfmadd213ps_avx512vl(auVar90,auVar153,_local_690);
    auVar90 = vsubps_avx(local_830,auVar88);
    uVar141 = auVar90._0_4_;
    auVar157._4_4_ = uVar141;
    auVar157._0_4_ = uVar141;
    auVar157._8_4_ = uVar141;
    auVar157._12_4_ = uVar141;
    auVar93 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    aVar4 = (local_7f0->vx).field_0;
    aVar5 = (local_7f0->vy).field_0;
    fVar160 = (local_7f0->vz).field_0.m128[0];
    fVar179 = *(float *)((long)&(local_7f0->vz).field_0 + 4);
    fVar182 = *(float *)((long)&(local_7f0->vz).field_0 + 8);
    fVar148 = *(float *)((long)&(local_7f0->vz).field_0 + 0xc);
    auVar181._0_4_ = fVar160 * auVar90._0_4_;
    auVar181._4_4_ = fVar179 * auVar90._4_4_;
    auVar181._8_4_ = fVar182 * auVar90._8_4_;
    auVar181._12_4_ = fVar148 * auVar90._12_4_;
    auVar93 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar93);
    auVar89 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar157);
    auVar90 = vsubps_avx(local_840,auVar88);
    uVar141 = auVar90._0_4_;
    auVar158._4_4_ = uVar141;
    auVar158._0_4_ = uVar141;
    auVar158._8_4_ = uVar141;
    auVar158._12_4_ = uVar141;
    auVar93 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar183._0_4_ = fVar160 * auVar90._0_4_;
    auVar183._4_4_ = fVar179 * auVar90._4_4_;
    auVar183._8_4_ = fVar182 * auVar90._8_4_;
    auVar183._12_4_ = fVar148 * auVar90._12_4_;
    auVar93 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar5,auVar93);
    auVar6 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar158);
    auVar90 = vsubps_avx(local_850,auVar88);
    uVar141 = auVar90._0_4_;
    auVar159._4_4_ = uVar141;
    auVar159._0_4_ = uVar141;
    auVar159._8_4_ = uVar141;
    auVar159._12_4_ = uVar141;
    auVar93 = vshufps_avx(auVar90,auVar90,0x55);
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    auVar185._0_4_ = fVar160 * auVar90._0_4_;
    auVar185._4_4_ = fVar179 * auVar90._4_4_;
    auVar185._8_4_ = fVar182 * auVar90._8_4_;
    auVar185._12_4_ = fVar148 * auVar90._12_4_;
    auVar93 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar93);
    auVar29 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar159);
    auVar93 = vsubps_avx512vl(_local_690,auVar88);
    uVar141 = auVar93._0_4_;
    auVar154._4_4_ = uVar141;
    auVar154._0_4_ = uVar141;
    auVar154._8_4_ = uVar141;
    auVar154._12_4_ = uVar141;
    auVar88 = vshufps_avx(auVar93,auVar93,0x55);
    auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar190._0_4_ = fVar160 * auVar93._0_4_;
    auVar190._4_4_ = fVar179 * auVar93._4_4_;
    auVar190._8_4_ = fVar182 * auVar93._8_4_;
    auVar190._12_4_ = fVar148 * auVar93._12_4_;
    auVar88 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar5,auVar88);
    auVar84 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar4,auVar154);
    lVar65 = (long)iVar8 * 0x44;
    auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar65);
    uVar141 = auVar89._0_4_;
    local_6e0._4_4_ = uVar141;
    local_6e0._0_4_ = uVar141;
    local_6e0._8_4_ = uVar141;
    local_6e0._12_4_ = uVar141;
    local_6e0._16_4_ = uVar141;
    local_6e0._20_4_ = uVar141;
    local_6e0._24_4_ = uVar141;
    local_6e0._28_4_ = uVar141;
    auVar94._8_4_ = 1;
    auVar94._0_8_ = 0x100000001;
    auVar94._12_4_ = 1;
    auVar94._16_4_ = 1;
    auVar94._20_4_ = 1;
    auVar94._24_4_ = 1;
    auVar94._28_4_ = 1;
    local_700 = vpermps_avx2(auVar94,ZEXT1632(auVar89));
    auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x484);
    uVar141 = auVar6._0_4_;
    local_760._4_4_ = uVar141;
    local_760._0_4_ = uVar141;
    local_760._8_4_ = uVar141;
    local_760._12_4_ = uVar141;
    local_760._16_4_ = uVar141;
    local_760._20_4_ = uVar141;
    local_760._24_4_ = uVar141;
    local_760._28_4_ = uVar141;
    local_720 = vpermps_avx512vl(auVar94,ZEXT1632(auVar6));
    auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x908);
    local_780 = vbroadcastss_avx512vl(auVar29);
    local_7a0 = vpermps_avx512vl(auVar94,ZEXT1632(auVar29));
    auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0xd8c);
    fVar179 = auVar84._0_4_;
    local_740._4_4_ = fVar179;
    local_740._0_4_ = fVar179;
    local_740._8_4_ = fVar179;
    local_740._12_4_ = fVar179;
    local_740._16_4_ = fVar179;
    local_740._20_4_ = fVar179;
    local_740._24_4_ = fVar179;
    local_740._28_4_ = fVar179;
    local_7c0 = vpermps_avx512vl(auVar94,ZEXT1632(auVar84));
    auVar94 = vmulps_avx512vl(local_740,auVar106);
    auVar95 = vmulps_avx512vl(local_7c0,auVar106);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_780);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar107,local_7a0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_760);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_720);
    auVar96 = vfmadd231ps_avx512vl(auVar94,auVar108,local_6e0);
    auVar97 = vfmadd231ps_avx512vl(auVar95,auVar108,local_700);
    auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar65);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x484);
    auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x908);
    auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0xd8c);
    auVar98 = vmulps_avx512vl(local_740,auVar104);
    auVar99 = vmulps_avx512vl(local_7c0,auVar104);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_780);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_7a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_760);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_720);
    auVar80 = vfmadd231ps_fma(auVar98,auVar94,local_6e0);
    auVar81 = vfmadd231ps_fma(auVar99,auVar94,local_700);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar80),auVar96);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
    auVar100 = vmulps_avx512vl(auVar97,auVar98);
    auVar101 = vmulps_avx512vl(auVar96,auVar99);
    auVar100 = vsubps_avx512vl(auVar100,auVar101);
    auVar88 = vshufps_avx(local_830,local_830,0xff);
    uVar149 = auVar88._0_8_;
    local_360._8_8_ = uVar149;
    local_360._0_8_ = uVar149;
    local_360._16_8_ = uVar149;
    local_360._24_8_ = uVar149;
    auVar88 = vshufps_avx(local_840,local_840,0xff);
    local_380 = vbroadcastsd_avx512vl(auVar88);
    auVar88 = vshufps_avx(local_850,local_850,0xff);
    local_3a0 = vbroadcastsd_avx512vl(auVar88);
    auVar88 = vshufps_avx512vl(_local_690,_local_690,0xff);
    uVar149 = auVar88._0_8_;
    register0x000012c8 = uVar149;
    local_3c0 = uVar149;
    register0x000012d0 = uVar149;
    register0x000012d8 = uVar149;
    auVar101 = vmulps_avx512vl(_local_3c0,auVar106);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_3a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_380);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_360);
    auVar102 = vmulps_avx512vl(_local_3c0,auVar104);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_3a0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar95,local_380);
    auVar82 = vfmadd231ps_fma(auVar102,auVar94,local_360);
    auVar102 = vmulps_avx512vl(auVar99,auVar99);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
    auVar103 = vmaxps_avx512vl(auVar101,ZEXT1632(auVar82));
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vmulps_avx512vl(auVar103,auVar102);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    uVar149 = vcmpps_avx512vl(auVar100,auVar102,2);
    auVar88 = vblendps_avx(auVar89,local_830,8);
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar93 = vandps_avx512vl(auVar88,auVar90);
    auVar88 = vblendps_avx(auVar6,local_840,8);
    auVar88 = vandps_avx512vl(auVar88,auVar90);
    auVar93 = vmaxps_avx(auVar93,auVar88);
    auVar88 = vblendps_avx(auVar29,local_850,8);
    auVar83 = vandps_avx512vl(auVar88,auVar90);
    auVar88 = vblendps_avx(auVar84,_local_690,8);
    auVar88 = vandps_avx512vl(auVar88,auVar90);
    auVar88 = vmaxps_avx(auVar83,auVar88);
    auVar88 = vmaxps_avx(auVar93,auVar88);
    auVar93 = vmovshdup_avx(auVar88);
    auVar93 = vmaxss_avx(auVar93,auVar88);
    auVar88 = vshufpd_avx(auVar88,auVar88,1);
    auVar90 = vcvtsi2ss_avx512f(_local_690,iVar8);
    auVar88 = vmaxss_avx(auVar88,auVar93);
    local_480._0_16_ = auVar90;
    fVar160 = auVar90._0_4_;
    auVar102._4_4_ = fVar160;
    auVar102._0_4_ = fVar160;
    auVar102._8_4_ = fVar160;
    auVar102._12_4_ = fVar160;
    auVar102._16_4_ = fVar160;
    auVar102._20_4_ = fVar160;
    auVar102._24_4_ = fVar160;
    auVar102._28_4_ = fVar160;
    uVar32 = vcmpps_avx512vl(auVar102,_DAT_01f7b060,0xe);
    bVar73 = (byte)uVar149 & (byte)uVar32;
    auVar88 = vmulss_avx512f(auVar88,ZEXT416(0x35000000));
    auVar100._8_4_ = 2;
    auVar100._0_8_ = 0x200000002;
    auVar100._12_4_ = 2;
    auVar100._16_4_ = 2;
    auVar100._20_4_ = 2;
    auVar100._24_4_ = 2;
    auVar100._28_4_ = 2;
    local_3e0 = vpermps_avx512vl(auVar100,ZEXT1632(auVar89));
    local_400 = vpermps_avx512vl(auVar100,ZEXT1632(auVar6));
    local_420 = vpermps_avx512vl(auVar100,ZEXT1632(auVar29));
    local_820 = vpermps_avx2(auVar100,ZEXT1632(auVar84));
    auVar147 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar147);
    uVar180 = *(uint *)(ray + k * 4 + 0xc0);
    auVar93 = local_3e0._0_16_;
    if (bVar73 == 0) {
      bVar68 = false;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar147 = ZEXT3264(auVar108);
      auVar93 = vxorps_avx512vl(auVar93,auVar93);
      auVar196 = ZEXT1664(auVar93);
      auVar197 = ZEXT3264(local_6e0);
      auVar198 = ZEXT3264(local_700);
      auVar199 = ZEXT3264(local_760);
      auVar200 = ZEXT3264(local_720);
      auVar201 = ZEXT3264(local_780);
      auVar204 = ZEXT3264(local_7a0);
      auVar202 = ZEXT3264(local_740);
      auVar203 = ZEXT3264(local_7c0);
    }
    else {
      local_7e0._0_16_ = ZEXT416(uVar180);
      local_6c0._0_16_ = auVar88;
      auVar104 = vmulps_avx512vl(local_820,auVar104);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_420,auVar104);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_400,auVar105);
      auVar100 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar95);
      auVar106 = vmulps_avx512vl(local_820,auVar106);
      auVar107 = vfmadd213ps_avx512vl(auVar107,local_420,auVar106);
      auVar95 = vfmadd213ps_avx512vl(auVar109,local_400,auVar107);
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1694);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1b18);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar65 + 0x1f9c);
      auVar102 = vfmadd213ps_avx512vl(auVar108,local_3e0,auVar95);
      auVar108 = vmulps_avx512vl(local_740,auVar94);
      auVar95 = vmulps_avx512vl(local_7c0,auVar94);
      auVar94 = vmulps_avx512vl(local_820,auVar94);
      auVar90 = vfmadd231ps_fma(auVar108,auVar106,local_780);
      auVar108 = vfmadd231ps_avx512vl(auVar95,auVar106,local_7a0);
      auVar106 = vfmadd231ps_avx512vl(auVar94,local_420,auVar106);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar107,local_760);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar107,local_720);
      auVar95 = vfmadd231ps_avx512vl(auVar106,local_400,auVar107);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,local_6e0);
      auVar105 = vfmadd231ps_avx512vl(auVar108,auVar109,local_700);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1210);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1b18);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1f9c);
      auVar104 = vfmadd231ps_avx512vl(auVar95,local_3e0,auVar109);
      auVar95._4_4_ = fVar179 * auVar106._4_4_;
      auVar95._0_4_ = fVar179 * auVar106._0_4_;
      auVar95._8_4_ = fVar179 * auVar106._8_4_;
      auVar95._12_4_ = fVar179 * auVar106._12_4_;
      auVar95._16_4_ = fVar179 * auVar106._16_4_;
      auVar95._20_4_ = fVar179 * auVar106._20_4_;
      auVar95._24_4_ = fVar179 * auVar106._24_4_;
      auVar95._28_4_ = auVar109._28_4_;
      auVar109 = vmulps_avx512vl(local_7c0,auVar106);
      auVar106 = vmulps_avx512vl(local_820,auVar106);
      auVar205 = ZEXT1664(auVar88);
      auVar90 = vfmadd231ps_fma(auVar95,auVar107,local_780);
      auVar95 = vfmadd231ps_avx512vl(auVar109,auVar107,local_7a0);
      auVar107 = vfmadd231ps_avx512vl(auVar106,local_420,auVar107);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar65 + 0x1694);
      auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar109,local_760);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_720);
      auVar109 = vfmadd231ps_avx512vl(auVar107,local_400,auVar109);
      auVar107 = vfmadd231ps_avx512vl(auVar106,auVar108,local_6e0);
      auVar106 = vfmadd231ps_avx512vl(auVar95,auVar108,local_700);
      auVar95 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar108);
      auVar194._8_4_ = 0x7fffffff;
      auVar194._0_8_ = 0x7fffffff7fffffff;
      auVar194._12_4_ = 0x7fffffff;
      auVar194._16_4_ = 0x7fffffff;
      auVar194._20_4_ = 0x7fffffff;
      auVar194._24_4_ = 0x7fffffff;
      auVar194._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar94,auVar194);
      auVar109 = vandps_avx(auVar105,auVar194);
      auVar109 = vmaxps_avx(auVar108,auVar109);
      auVar108 = vandps_avx(auVar104,auVar194);
      auVar108 = vmaxps_avx(auVar109,auVar108);
      auVar104 = vbroadcastss_avx512vl(auVar88);
      uVar64 = vcmpps_avx512vl(auVar108,auVar104,1);
      bVar68 = (bool)((byte)uVar64 & 1);
      auVar120._0_4_ = (float)((uint)bVar68 * auVar98._0_4_ | (uint)!bVar68 * auVar94._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar68 * auVar98._4_4_ | (uint)!bVar68 * auVar94._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar68 * auVar98._8_4_ | (uint)!bVar68 * auVar94._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar68 * auVar98._12_4_ | (uint)!bVar68 * auVar94._12_4_);
      bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar120._16_4_ = (float)((uint)bVar68 * auVar98._16_4_ | (uint)!bVar68 * auVar94._16_4_);
      bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar120._20_4_ = (float)((uint)bVar68 * auVar98._20_4_ | (uint)!bVar68 * auVar94._20_4_);
      bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar120._24_4_ = (float)((uint)bVar68 * auVar98._24_4_ | (uint)!bVar68 * auVar94._24_4_);
      bVar68 = SUB81(uVar64 >> 7,0);
      auVar120._28_4_ = (uint)bVar68 * auVar98._28_4_ | (uint)!bVar68 * auVar94._28_4_;
      bVar68 = (bool)((byte)uVar64 & 1);
      auVar110._0_4_ = (float)((uint)bVar68 * auVar99._0_4_ | (uint)!bVar68 * auVar105._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * auVar105._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * auVar105._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * auVar105._12_4_);
      bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * auVar105._16_4_);
      bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * auVar105._20_4_);
      bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * auVar105._24_4_);
      bVar68 = SUB81(uVar64 >> 7,0);
      auVar110._28_4_ = (uint)bVar68 * auVar99._28_4_ | (uint)!bVar68 * auVar105._28_4_;
      auVar108 = vandps_avx(auVar194,auVar107);
      auVar109 = vandps_avx(auVar106,auVar194);
      auVar109 = vmaxps_avx(auVar108,auVar109);
      auVar108 = vandps_avx(auVar95,auVar194);
      auVar108 = vmaxps_avx(auVar109,auVar108);
      uVar64 = vcmpps_avx512vl(auVar108,auVar104,1);
      bVar68 = (bool)((byte)uVar64 & 1);
      auVar111._0_4_ = (float)((uint)bVar68 * auVar98._0_4_ | (uint)!bVar68 * auVar107._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar68 * auVar98._4_4_ | (uint)!bVar68 * auVar107._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar68 * auVar98._8_4_ | (uint)!bVar68 * auVar107._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar68 * auVar98._12_4_ | (uint)!bVar68 * auVar107._12_4_);
      bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar68 * auVar98._16_4_ | (uint)!bVar68 * auVar107._16_4_);
      bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar68 * auVar98._20_4_ | (uint)!bVar68 * auVar107._20_4_);
      bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar68 * auVar98._24_4_ | (uint)!bVar68 * auVar107._24_4_);
      bVar68 = SUB81(uVar64 >> 7,0);
      auVar111._28_4_ = (uint)bVar68 * auVar98._28_4_ | (uint)!bVar68 * auVar107._28_4_;
      bVar68 = (bool)((byte)uVar64 & 1);
      auVar112._0_4_ = (float)((uint)bVar68 * auVar99._0_4_ | (uint)!bVar68 * auVar106._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar68 * auVar99._4_4_ | (uint)!bVar68 * auVar106._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar68 * auVar99._8_4_ | (uint)!bVar68 * auVar106._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar68 * auVar99._12_4_ | (uint)!bVar68 * auVar106._12_4_);
      bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar68 * auVar99._16_4_ | (uint)!bVar68 * auVar106._16_4_);
      bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar68 * auVar99._20_4_ | (uint)!bVar68 * auVar106._20_4_);
      bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar68 * auVar99._24_4_ | (uint)!bVar68 * auVar106._24_4_);
      bVar68 = SUB81(uVar64 >> 7,0);
      auVar112._28_4_ = (uint)bVar68 * auVar99._28_4_ | (uint)!bVar68 * auVar106._28_4_;
      auVar87 = vxorps_avx512vl(auVar93,auVar93);
      auVar196 = ZEXT1664(auVar87);
      auVar108 = vfmadd213ps_avx512vl(auVar120,auVar120,ZEXT1632(auVar87));
      auVar93 = vfmadd231ps_fma(auVar108,auVar110,auVar110);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
      fVar179 = auVar107._0_4_;
      fVar182 = auVar107._4_4_;
      fVar148 = auVar107._8_4_;
      fVar175 = auVar107._12_4_;
      fVar174 = auVar107._16_4_;
      fVar177 = auVar107._20_4_;
      fVar74 = auVar107._24_4_;
      auVar108._4_4_ = fVar182 * fVar182 * fVar182 * auVar93._4_4_ * -0.5;
      auVar108._0_4_ = fVar179 * fVar179 * fVar179 * auVar93._0_4_ * -0.5;
      auVar108._8_4_ = fVar148 * fVar148 * fVar148 * auVar93._8_4_ * -0.5;
      auVar108._12_4_ = fVar175 * fVar175 * fVar175 * auVar93._12_4_ * -0.5;
      auVar108._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
      auVar108._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
      auVar108._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
      auVar108._28_4_ = 0;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar107);
      auVar109._4_4_ = auVar110._4_4_ * auVar108._4_4_;
      auVar109._0_4_ = auVar110._0_4_ * auVar108._0_4_;
      auVar109._8_4_ = auVar110._8_4_ * auVar108._8_4_;
      auVar109._12_4_ = auVar110._12_4_ * auVar108._12_4_;
      auVar109._16_4_ = auVar110._16_4_ * auVar108._16_4_;
      auVar109._20_4_ = auVar110._20_4_ * auVar108._20_4_;
      auVar109._24_4_ = auVar110._24_4_ * auVar108._24_4_;
      auVar109._28_4_ = auVar107._28_4_;
      auVar107._4_4_ = auVar108._4_4_ * -auVar120._4_4_;
      auVar107._0_4_ = auVar108._0_4_ * -auVar120._0_4_;
      auVar107._8_4_ = auVar108._8_4_ * -auVar120._8_4_;
      auVar107._12_4_ = auVar108._12_4_ * -auVar120._12_4_;
      auVar107._16_4_ = auVar108._16_4_ * -auVar120._16_4_;
      auVar107._20_4_ = auVar108._20_4_ * -auVar120._20_4_;
      auVar107._24_4_ = auVar108._24_4_ * -auVar120._24_4_;
      auVar107._28_4_ = auVar120._28_4_ ^ 0x80000000;
      auVar95 = vmulps_avx512vl(auVar108,ZEXT1632(auVar87));
      auVar98 = ZEXT1632(auVar87);
      auVar106 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar98);
      auVar93 = vfmadd231ps_fma(auVar106,auVar112,auVar112);
      auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
      fVar179 = auVar104._0_4_;
      fVar182 = auVar104._4_4_;
      fVar148 = auVar104._8_4_;
      fVar175 = auVar104._12_4_;
      fVar174 = auVar104._16_4_;
      fVar177 = auVar104._20_4_;
      fVar74 = auVar104._24_4_;
      auVar106._4_4_ = fVar182 * fVar182 * fVar182 * auVar93._4_4_ * -0.5;
      auVar106._0_4_ = fVar179 * fVar179 * fVar179 * auVar93._0_4_ * -0.5;
      auVar106._8_4_ = fVar148 * fVar148 * fVar148 * auVar93._8_4_ * -0.5;
      auVar106._12_4_ = fVar175 * fVar175 * fVar175 * auVar93._12_4_ * -0.5;
      auVar106._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
      auVar106._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
      auVar106._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
      auVar106._28_4_ = 0;
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar94,auVar104);
      auVar105._4_4_ = auVar112._4_4_ * auVar106._4_4_;
      auVar105._0_4_ = auVar112._0_4_ * auVar106._0_4_;
      auVar105._8_4_ = auVar112._8_4_ * auVar106._8_4_;
      auVar105._12_4_ = auVar112._12_4_ * auVar106._12_4_;
      auVar105._16_4_ = auVar112._16_4_ * auVar106._16_4_;
      auVar105._20_4_ = auVar112._20_4_ * auVar106._20_4_;
      auVar105._24_4_ = auVar112._24_4_ * auVar106._24_4_;
      auVar105._28_4_ = auVar104._28_4_;
      auVar104._4_4_ = -auVar111._4_4_ * auVar106._4_4_;
      auVar104._0_4_ = -auVar111._0_4_ * auVar106._0_4_;
      auVar104._8_4_ = -auVar111._8_4_ * auVar106._8_4_;
      auVar104._12_4_ = -auVar111._12_4_ * auVar106._12_4_;
      auVar104._16_4_ = -auVar111._16_4_ * auVar106._16_4_;
      auVar104._20_4_ = -auVar111._20_4_ * auVar106._20_4_;
      auVar104._24_4_ = -auVar111._24_4_ * auVar106._24_4_;
      auVar104._28_4_ = auVar108._28_4_;
      auVar108 = vmulps_avx512vl(auVar106,auVar98);
      auVar93 = vfmadd213ps_fma(auVar109,auVar101,auVar96);
      auVar90 = vfmadd213ps_fma(auVar107,auVar101,auVar97);
      auVar106 = vfmadd213ps_avx512vl(auVar95,auVar101,auVar102);
      auVar94 = vfmadd213ps_avx512vl(auVar105,ZEXT1632(auVar82),ZEXT1632(auVar80));
      auVar83 = vfnmadd213ps_fma(auVar109,auVar101,auVar96);
      auVar96 = ZEXT1632(auVar82);
      auVar89 = vfmadd213ps_fma(auVar104,auVar96,ZEXT1632(auVar81));
      auVar85 = vfnmadd213ps_fma(auVar107,auVar101,auVar97);
      auVar6 = vfmadd213ps_fma(auVar108,auVar96,auVar100);
      auVar109 = vfnmadd231ps_avx512vl(auVar102,auVar101,auVar95);
      auVar80 = vfnmadd213ps_fma(auVar105,auVar96,ZEXT1632(auVar80));
      auVar81 = vfnmadd213ps_fma(auVar104,auVar96,ZEXT1632(auVar81));
      auVar86 = vfnmadd231ps_fma(auVar100,ZEXT1632(auVar82),auVar108);
      auVar107 = vsubps_avx512vl(auVar94,ZEXT1632(auVar83));
      auVar108 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar85));
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar6),auVar109);
      auVar105 = vmulps_avx512vl(auVar108,auVar109);
      auVar29 = vfmsub231ps_fma(auVar105,ZEXT1632(auVar85),auVar95);
      auVar96._4_4_ = auVar83._4_4_ * auVar95._4_4_;
      auVar96._0_4_ = auVar83._0_4_ * auVar95._0_4_;
      auVar96._8_4_ = auVar83._8_4_ * auVar95._8_4_;
      auVar96._12_4_ = auVar83._12_4_ * auVar95._12_4_;
      auVar96._16_4_ = auVar95._16_4_ * 0.0;
      auVar96._20_4_ = auVar95._20_4_ * 0.0;
      auVar96._24_4_ = auVar95._24_4_ * 0.0;
      auVar96._28_4_ = auVar95._28_4_;
      auVar95 = vfmsub231ps_avx512vl(auVar96,auVar109,auVar107);
      auVar97._4_4_ = auVar85._4_4_ * auVar107._4_4_;
      auVar97._0_4_ = auVar85._0_4_ * auVar107._0_4_;
      auVar97._8_4_ = auVar85._8_4_ * auVar107._8_4_;
      auVar97._12_4_ = auVar85._12_4_ * auVar107._12_4_;
      auVar97._16_4_ = auVar107._16_4_ * 0.0;
      auVar97._20_4_ = auVar107._20_4_ * 0.0;
      auVar97._24_4_ = auVar107._24_4_ * 0.0;
      auVar97._28_4_ = auVar107._28_4_;
      auVar84 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar83),auVar108);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar98,auVar95);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,ZEXT1632(auVar29));
      auVar100 = ZEXT1632(auVar87);
      uVar64 = vcmpps_avx512vl(auVar108,auVar100,2);
      bVar63 = (byte)uVar64;
      fVar74 = (float)((uint)(bVar63 & 1) * auVar93._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar80._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      fVar133 = (float)((uint)bVar68 * auVar93._4_4_ | (uint)!bVar68 * auVar80._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      fVar135 = (float)((uint)bVar68 * auVar93._8_4_ | (uint)!bVar68 * auVar80._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      fVar137 = (float)((uint)bVar68 * auVar93._12_4_ | (uint)!bVar68 * auVar80._12_4_);
      auVar105 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar74))));
      fVar75 = (float)((uint)(bVar63 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar81._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      fVar134 = (float)((uint)bVar68 * auVar90._4_4_ | (uint)!bVar68 * auVar81._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      fVar136 = (float)((uint)bVar68 * auVar90._8_4_ | (uint)!bVar68 * auVar81._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      fVar138 = (float)((uint)bVar68 * auVar90._12_4_ | (uint)!bVar68 * auVar81._12_4_);
      auVar104 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar75))));
      auVar113._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar86._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar68 * auVar106._4_4_ | (uint)!bVar68 * auVar86._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar68 * auVar106._8_4_ | (uint)!bVar68 * auVar86._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar68 * auVar106._12_4_ | (uint)!bVar68 * auVar86._12_4_);
      fVar182 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar106._16_4_);
      auVar113._16_4_ = fVar182;
      fVar179 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar106._20_4_);
      auVar113._20_4_ = fVar179;
      fVar148 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar106._24_4_);
      auVar113._24_4_ = fVar148;
      iVar1 = (uint)(byte)(uVar64 >> 7) * auVar106._28_4_;
      auVar113._28_4_ = iVar1;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar94);
      auVar114._0_4_ =
           (uint)(bVar63 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar90._0_4_;
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar68 * auVar107._4_4_ | (uint)!bVar68 * auVar90._4_4_;
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar68 * auVar107._8_4_ | (uint)!bVar68 * auVar90._8_4_;
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar68 * auVar107._12_4_ | (uint)!bVar68 * auVar90._12_4_;
      auVar114._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar107._16_4_;
      auVar114._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar107._20_4_;
      auVar114._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar107._24_4_;
      auVar114._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar89));
      auVar115._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar29._0_4_);
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar68 * auVar107._4_4_ | (uint)!bVar68 * auVar29._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar68 * auVar107._8_4_ | (uint)!bVar68 * auVar29._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar68 * auVar107._12_4_ | (uint)!bVar68 * auVar29._12_4_);
      fVar175 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar107._16_4_);
      auVar115._16_4_ = fVar175;
      fVar174 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar107._20_4_);
      auVar115._20_4_ = fVar174;
      fVar177 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar107._24_4_);
      auVar115._24_4_ = fVar177;
      auVar115._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar107._28_4_;
      auVar107 = vblendmps_avx512vl(auVar109,ZEXT1632(auVar6));
      auVar116._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar106._0_4_)
      ;
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar68 * auVar107._4_4_ | (uint)!bVar68 * auVar106._4_4_);
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar68 * auVar107._8_4_ | (uint)!bVar68 * auVar106._8_4_);
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar68 * auVar107._12_4_ | (uint)!bVar68 * auVar106._12_4_);
      bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar116._16_4_ = (float)((uint)bVar68 * auVar107._16_4_ | (uint)!bVar68 * auVar106._16_4_);
      bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar116._20_4_ = (float)((uint)bVar68 * auVar107._20_4_ | (uint)!bVar68 * auVar106._20_4_);
      bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar116._24_4_ = (float)((uint)bVar68 * auVar107._24_4_ | (uint)!bVar68 * auVar106._24_4_);
      bVar68 = SUB81(uVar64 >> 7,0);
      auVar116._28_4_ = (uint)bVar68 * auVar107._28_4_ | (uint)!bVar68 * auVar106._28_4_;
      auVar117._0_4_ =
           (uint)(bVar63 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar94._0_4_;
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar68 * (int)auVar83._4_4_ | (uint)!bVar68 * auVar94._4_4_;
      bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar68 * (int)auVar83._8_4_ | (uint)!bVar68 * auVar94._8_4_;
      bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar68 * (int)auVar83._12_4_ | (uint)!bVar68 * auVar94._12_4_;
      auVar117._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar94._16_4_;
      auVar117._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar94._20_4_;
      auVar117._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar94._24_4_;
      auVar117._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar94._28_4_;
      bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar118._0_4_ =
           (uint)(bVar63 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar6._0_4_;
      bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar6._4_4_;
      bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar6._8_4_;
      bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar6._12_4_;
      auVar118._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar109._16_4_;
      auVar118._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar109._20_4_;
      auVar118._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar109._24_4_;
      iVar2 = (uint)(byte)(uVar64 >> 7) * auVar109._28_4_;
      auVar118._28_4_ = iVar2;
      auVar96 = vsubps_avx512vl(auVar117,auVar105);
      auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar85._12_4_ |
                                               (uint)!bVar16 * auVar89._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar85._8_4_ |
                                                        (uint)!bVar15 * auVar89._8_4_,
                                                        CONCAT44((uint)bVar68 * (int)auVar85._4_4_ |
                                                                 (uint)!bVar68 * auVar89._4_4_,
                                                                 (uint)(bVar63 & 1) *
                                                                 (int)auVar85._0_4_ |
                                                                 (uint)!(bool)(bVar63 & 1) *
                                                                 auVar89._0_4_)))),auVar104);
      auVar107 = vsubps_avx(auVar118,auVar113);
      auVar106 = vsubps_avx(auVar105,auVar114);
      auVar94 = vsubps_avx(auVar104,auVar115);
      auVar95 = vsubps_avx(auVar113,auVar116);
      auVar98._4_4_ = auVar107._4_4_ * fVar133;
      auVar98._0_4_ = auVar107._0_4_ * fVar74;
      auVar98._8_4_ = auVar107._8_4_ * fVar135;
      auVar98._12_4_ = auVar107._12_4_ * fVar137;
      auVar98._16_4_ = auVar107._16_4_ * 0.0;
      auVar98._20_4_ = auVar107._20_4_ * 0.0;
      auVar98._24_4_ = auVar107._24_4_ * 0.0;
      auVar98._28_4_ = iVar2;
      auVar93 = vfmsub231ps_fma(auVar98,auVar113,auVar96);
      auVar99._4_4_ = fVar134 * auVar96._4_4_;
      auVar99._0_4_ = fVar75 * auVar96._0_4_;
      auVar99._8_4_ = fVar136 * auVar96._8_4_;
      auVar99._12_4_ = fVar138 * auVar96._12_4_;
      auVar99._16_4_ = auVar96._16_4_ * 0.0;
      auVar99._20_4_ = auVar96._20_4_ * 0.0;
      auVar99._24_4_ = auVar96._24_4_ * 0.0;
      auVar99._28_4_ = auVar108._28_4_;
      auVar90 = vfmsub231ps_fma(auVar99,auVar105,auVar109);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar100,ZEXT1632(auVar93));
      auVar166._0_4_ = auVar109._0_4_ * auVar113._0_4_;
      auVar166._4_4_ = auVar109._4_4_ * auVar113._4_4_;
      auVar166._8_4_ = auVar109._8_4_ * auVar113._8_4_;
      auVar166._12_4_ = auVar109._12_4_ * auVar113._12_4_;
      auVar166._16_4_ = auVar109._16_4_ * fVar182;
      auVar166._20_4_ = auVar109._20_4_ * fVar179;
      auVar166._24_4_ = auVar109._24_4_ * fVar148;
      auVar166._28_4_ = 0;
      auVar93 = vfmsub231ps_fma(auVar166,auVar104,auVar107);
      auVar97 = vfmadd231ps_avx512vl(auVar108,auVar100,ZEXT1632(auVar93));
      auVar108 = vmulps_avx512vl(auVar95,auVar114);
      auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar116);
      auVar103._4_4_ = auVar94._4_4_ * auVar116._4_4_;
      auVar103._0_4_ = auVar94._0_4_ * auVar116._0_4_;
      auVar103._8_4_ = auVar94._8_4_ * auVar116._8_4_;
      auVar103._12_4_ = auVar94._12_4_ * auVar116._12_4_;
      auVar103._16_4_ = auVar94._16_4_ * auVar116._16_4_;
      auVar103._20_4_ = auVar94._20_4_ * auVar116._20_4_;
      auVar103._24_4_ = auVar94._24_4_ * auVar116._24_4_;
      auVar103._28_4_ = auVar116._28_4_;
      auVar93 = vfmsub231ps_fma(auVar103,auVar115,auVar95);
      auVar167._0_4_ = auVar115._0_4_ * auVar106._0_4_;
      auVar167._4_4_ = auVar115._4_4_ * auVar106._4_4_;
      auVar167._8_4_ = auVar115._8_4_ * auVar106._8_4_;
      auVar167._12_4_ = auVar115._12_4_ * auVar106._12_4_;
      auVar167._16_4_ = fVar175 * auVar106._16_4_;
      auVar167._20_4_ = fVar174 * auVar106._20_4_;
      auVar167._24_4_ = fVar177 * auVar106._24_4_;
      auVar167._28_4_ = 0;
      auVar90 = vfmsub231ps_fma(auVar167,auVar94,auVar114);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar100,auVar108);
      auVar98 = vfmadd231ps_avx512vl(auVar108,auVar100,ZEXT1632(auVar93));
      auVar108 = vmaxps_avx(auVar97,auVar98);
      uVar149 = vcmpps_avx512vl(auVar108,auVar100,2);
      bVar73 = bVar73 & (byte)uVar149;
      auVar197 = ZEXT3264(local_6e0);
      auVar198 = ZEXT3264(local_700);
      auVar199 = ZEXT3264(local_760);
      auVar200 = ZEXT3264(local_720);
      auVar201 = ZEXT3264(local_780);
      auVar204 = ZEXT3264(local_7a0);
      auVar202 = ZEXT3264(local_740);
      auVar203 = ZEXT3264(local_7c0);
      if (bVar73 == 0) {
        bVar68 = false;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar147 = ZEXT3264(auVar108);
      }
      else {
        auVar39._4_4_ = auVar95._4_4_ * auVar109._4_4_;
        auVar39._0_4_ = auVar95._0_4_ * auVar109._0_4_;
        auVar39._8_4_ = auVar95._8_4_ * auVar109._8_4_;
        auVar39._12_4_ = auVar95._12_4_ * auVar109._12_4_;
        auVar39._16_4_ = auVar95._16_4_ * auVar109._16_4_;
        auVar39._20_4_ = auVar95._20_4_ * auVar109._20_4_;
        auVar39._24_4_ = auVar95._24_4_ * auVar109._24_4_;
        auVar39._28_4_ = auVar108._28_4_;
        auVar89 = vfmsub231ps_fma(auVar39,auVar94,auVar107);
        auVar40._4_4_ = auVar107._4_4_ * auVar106._4_4_;
        auVar40._0_4_ = auVar107._0_4_ * auVar106._0_4_;
        auVar40._8_4_ = auVar107._8_4_ * auVar106._8_4_;
        auVar40._12_4_ = auVar107._12_4_ * auVar106._12_4_;
        auVar40._16_4_ = auVar107._16_4_ * auVar106._16_4_;
        auVar40._20_4_ = auVar107._20_4_ * auVar106._20_4_;
        auVar40._24_4_ = auVar107._24_4_ * auVar106._24_4_;
        auVar40._28_4_ = auVar107._28_4_;
        auVar90 = vfmsub231ps_fma(auVar40,auVar96,auVar95);
        auVar41._4_4_ = auVar94._4_4_ * auVar96._4_4_;
        auVar41._0_4_ = auVar94._0_4_ * auVar96._0_4_;
        auVar41._8_4_ = auVar94._8_4_ * auVar96._8_4_;
        auVar41._12_4_ = auVar94._12_4_ * auVar96._12_4_;
        auVar41._16_4_ = auVar94._16_4_ * auVar96._16_4_;
        auVar41._20_4_ = auVar94._20_4_ * auVar96._20_4_;
        auVar41._24_4_ = auVar94._24_4_ * auVar96._24_4_;
        auVar41._28_4_ = auVar94._28_4_;
        auVar6 = vfmsub231ps_fma(auVar41,auVar106,auVar109);
        auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar6));
        auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar89),auVar100);
        auVar109 = vrcp14ps_avx512vl(auVar108);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar147 = ZEXT3264(auVar107);
        auVar106 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar107);
        auVar93 = vfmadd132ps_fma(auVar106,auVar109,auVar109);
        auVar42._4_4_ = auVar6._4_4_ * auVar113._4_4_;
        auVar42._0_4_ = auVar6._0_4_ * auVar113._0_4_;
        auVar42._8_4_ = auVar6._8_4_ * auVar113._8_4_;
        auVar42._12_4_ = auVar6._12_4_ * auVar113._12_4_;
        auVar42._16_4_ = fVar182 * 0.0;
        auVar42._20_4_ = fVar179 * 0.0;
        auVar42._24_4_ = fVar148 * 0.0;
        auVar42._28_4_ = iVar1;
        auVar90 = vfmadd231ps_fma(auVar42,auVar104,ZEXT1632(auVar90));
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar105,ZEXT1632(auVar89));
        fVar179 = auVar93._0_4_;
        fVar182 = auVar93._4_4_;
        fVar148 = auVar93._8_4_;
        fVar175 = auVar93._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar175,
                                       CONCAT48(auVar90._8_4_ * fVar148,
                                                CONCAT44(auVar90._4_4_ * fVar182,
                                                         auVar90._0_4_ * fVar179))));
        auVar178._4_4_ = uVar180;
        auVar178._0_4_ = uVar180;
        auVar178._8_4_ = uVar180;
        auVar178._12_4_ = uVar180;
        auVar178._16_4_ = uVar180;
        auVar178._20_4_ = uVar180;
        auVar178._24_4_ = uVar180;
        auVar178._28_4_ = uVar180;
        uVar149 = vcmpps_avx512vl(auVar178,local_5a0,2);
        uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar141;
        auVar34._0_4_ = uVar141;
        auVar34._8_4_ = uVar141;
        auVar34._12_4_ = uVar141;
        auVar34._16_4_ = uVar141;
        auVar34._20_4_ = uVar141;
        auVar34._24_4_ = uVar141;
        auVar34._28_4_ = uVar141;
        uVar32 = vcmpps_avx512vl(local_5a0,auVar34,2);
        bVar73 = (byte)uVar149 & (byte)uVar32 & bVar73;
        if (bVar73 != 0) {
          uVar149 = vcmpps_avx512vl(auVar108,auVar100,4);
          bVar73 = bVar73 & (byte)uVar149;
          if (bVar73 != 0) {
            fVar174 = auVar97._0_4_ * fVar179;
            fVar177 = auVar97._4_4_ * fVar182;
            auVar43._4_4_ = fVar177;
            auVar43._0_4_ = fVar174;
            fVar74 = auVar97._8_4_ * fVar148;
            auVar43._8_4_ = fVar74;
            fVar75 = auVar97._12_4_ * fVar175;
            auVar43._12_4_ = fVar75;
            fVar133 = auVar97._16_4_ * 0.0;
            auVar43._16_4_ = fVar133;
            fVar134 = auVar97._20_4_ * 0.0;
            auVar43._20_4_ = fVar134;
            fVar135 = auVar97._24_4_ * 0.0;
            auVar43._24_4_ = fVar135;
            auVar43._28_4_ = auVar108._28_4_;
            auVar109 = vsubps_avx512vl(auVar107,auVar43);
            local_5e0._0_4_ =
                 (float)((uint)(bVar63 & 1) * (int)fVar174 |
                        (uint)!(bool)(bVar63 & 1) * auVar109._0_4_);
            bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar68 * (int)fVar177 | (uint)!bVar68 * auVar109._4_4_);
            bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar68 * (int)fVar74 | (uint)!bVar68 * auVar109._8_4_);
            bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar68 * (int)fVar75 | (uint)!bVar68 * auVar109._12_4_)
            ;
            bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar68 * (int)fVar133 | (uint)!bVar68 * auVar109._16_4_);
            bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar68 * (int)fVar134 | (uint)!bVar68 * auVar109._20_4_);
            bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar68 * (int)fVar135 | (uint)!bVar68 * auVar109._24_4_);
            bVar68 = SUB81(uVar64 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar68 * auVar108._28_4_ | (uint)!bVar68 * auVar109._28_4_);
            auVar108 = vsubps_avx(ZEXT1632(auVar82),auVar101);
            auVar93 = vfmadd213ps_fma(auVar108,local_5e0,auVar101);
            uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar101._4_4_ = uVar141;
            auVar101._0_4_ = uVar141;
            auVar101._8_4_ = uVar141;
            auVar101._12_4_ = uVar141;
            auVar101._16_4_ = uVar141;
            auVar101._20_4_ = uVar141;
            auVar101._24_4_ = uVar141;
            auVar101._28_4_ = uVar141;
            auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                          CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                   CONCAT44(auVar93._4_4_ +
                                                                            auVar93._4_4_,
                                                                            auVar93._0_4_ +
                                                                            auVar93._0_4_)))),
                                       auVar101);
            uVar149 = vcmpps_avx512vl(local_5a0,auVar108,6);
            if (((byte)uVar149 & bVar73) != 0) {
              auVar163._0_4_ = auVar98._0_4_ * fVar179;
              auVar163._4_4_ = auVar98._4_4_ * fVar182;
              auVar163._8_4_ = auVar98._8_4_ * fVar148;
              auVar163._12_4_ = auVar98._12_4_ * fVar175;
              auVar163._16_4_ = auVar98._16_4_ * 0.0;
              auVar163._20_4_ = auVar98._20_4_ * 0.0;
              auVar163._24_4_ = auVar98._24_4_ * 0.0;
              auVar163._28_4_ = 0;
              auVar108 = vsubps_avx512vl(auVar107,auVar163);
              auVar119._0_4_ =
                   (uint)(bVar63 & 1) * (int)auVar163._0_4_ |
                   (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
              bVar68 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar68 * (int)auVar163._4_4_ | (uint)!bVar68 * auVar108._4_4_;
              bVar68 = (bool)((byte)(uVar64 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar68 * (int)auVar163._8_4_ | (uint)!bVar68 * auVar108._8_4_;
              bVar68 = (bool)((byte)(uVar64 >> 3) & 1);
              auVar119._12_4_ =
                   (uint)bVar68 * (int)auVar163._12_4_ | (uint)!bVar68 * auVar108._12_4_;
              bVar68 = (bool)((byte)(uVar64 >> 4) & 1);
              auVar119._16_4_ =
                   (uint)bVar68 * (int)auVar163._16_4_ | (uint)!bVar68 * auVar108._16_4_;
              bVar68 = (bool)((byte)(uVar64 >> 5) & 1);
              auVar119._20_4_ =
                   (uint)bVar68 * (int)auVar163._20_4_ | (uint)!bVar68 * auVar108._20_4_;
              bVar68 = (bool)((byte)(uVar64 >> 6) & 1);
              auVar119._24_4_ =
                   (uint)bVar68 * (int)auVar163._24_4_ | (uint)!bVar68 * auVar108._24_4_;
              auVar119._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar108._28_4_;
              auVar35._8_4_ = 0x40000000;
              auVar35._0_8_ = 0x4000000040000000;
              auVar35._12_4_ = 0x40000000;
              auVar35._16_4_ = 0x40000000;
              auVar35._20_4_ = 0x40000000;
              auVar35._24_4_ = 0x40000000;
              auVar35._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar119,auVar107,auVar35);
              local_580 = 0;
              local_570 = local_830._0_8_;
              uStack_568 = local_830._8_8_;
              local_560 = local_840._0_8_;
              uStack_558 = local_840._8_8_;
              local_550 = local_850._0_8_;
              uStack_548 = local_850._8_8_;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar68 = true, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01927b8b;
                fVar160 = 1.0 / fVar160;
                local_520[0] = fVar160 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar160 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar160 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar160 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar160 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar160 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar160 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                uVar64 = 0;
                uVar69 = (ulong)((byte)uVar149 & bVar73);
                for (uVar67 = uVar69; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000)
                {
                  uVar64 = uVar64 + 1;
                }
                auVar131 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar131);
                local_57c = iVar8;
                while( true ) {
                  auVar88 = auVar205._0_16_;
                  auVar93 = auVar196._0_16_;
                  if (uVar69 == 0) break;
                  uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar64]));
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar64 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar64 * 4);
                  local_880.context = context->user;
                  fVar148 = local_200._0_4_;
                  fVar179 = 1.0 - fVar148;
                  fVar160 = fVar179 * fVar179 * -3.0;
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                            ZEXT416((uint)(fVar148 * fVar179)),ZEXT416(0xc0000000));
                  auVar90 = vfmsub132ss_fma(ZEXT416((uint)(fVar148 * fVar179)),
                                            ZEXT416((uint)(fVar148 * fVar148)),ZEXT416(0x40000000));
                  fVar179 = auVar88._0_4_ * 3.0;
                  fVar182 = auVar90._0_4_ * 3.0;
                  fVar148 = fVar148 * fVar148 * 3.0;
                  auVar172._0_4_ = fVar148 * (float)local_690._0_4_;
                  auVar172._4_4_ = fVar148 * (float)local_690._4_4_;
                  auVar172._8_4_ = fVar148 * fStack_688;
                  auVar172._12_4_ = fVar148 * fStack_684;
                  auVar143._4_4_ = fVar182;
                  auVar143._0_4_ = fVar182;
                  auVar143._8_4_ = fVar182;
                  auVar143._12_4_ = fVar182;
                  auVar88 = vfmadd132ps_fma(auVar143,auVar172,local_850);
                  auVar161._4_4_ = fVar179;
                  auVar161._0_4_ = fVar179;
                  auVar161._8_4_ = fVar179;
                  auVar161._12_4_ = fVar179;
                  auVar88 = vfmadd132ps_fma(auVar161,auVar88,local_840);
                  auVar144._4_4_ = fVar160;
                  auVar144._0_4_ = fVar160;
                  auVar144._8_4_ = fVar160;
                  auVar144._12_4_ = fVar160;
                  auVar88 = vfmadd132ps_fma(auVar144,auVar88,local_830);
                  auVar131 = vbroadcastss_avx512f(auVar88);
                  auVar132 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar132,ZEXT1664(auVar88));
                  auVar132 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar132,ZEXT1664(auVar88));
                  local_2c0[0] = (RTCHitN)auVar131[0];
                  local_2c0[1] = (RTCHitN)auVar131[1];
                  local_2c0[2] = (RTCHitN)auVar131[2];
                  local_2c0[3] = (RTCHitN)auVar131[3];
                  local_2c0[4] = (RTCHitN)auVar131[4];
                  local_2c0[5] = (RTCHitN)auVar131[5];
                  local_2c0[6] = (RTCHitN)auVar131[6];
                  local_2c0[7] = (RTCHitN)auVar131[7];
                  local_2c0[8] = (RTCHitN)auVar131[8];
                  local_2c0[9] = (RTCHitN)auVar131[9];
                  local_2c0[10] = (RTCHitN)auVar131[10];
                  local_2c0[0xb] = (RTCHitN)auVar131[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar131[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar131[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar131[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar131[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar131[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar131[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar131[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar131[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar131[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar131[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar131[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar131[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar131[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar131[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar131[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar131[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar131[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar131[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar131[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar131[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar131[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar131[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar131[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar131[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar131[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar131[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar131[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar131[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar131[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar131[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar131[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar131[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar131[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar131[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar131[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar131[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar131[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar131[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar131[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar131[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar131[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar131[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar131[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar131[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar131[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar131[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar131[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar131[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar131[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar131[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar131[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar131[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar131 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar131);
                  vpcmpeqd_avx2(auVar131._0_32_,auVar131._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instPrimID[0]));
                  auVar131 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar131);
                  local_880.valid = (int *)local_640;
                  local_880.geometryUserPtr = pGVar9->userPtr;
                  local_880.hit = local_2c0;
                  local_880.N = 0x10;
                  local_660 = (uint)uVar69;
                  uStack_65c = (uint)(uVar69 >> 0x20);
                  local_680 = (undefined1  [8])uVar64;
                  auVar70 = (undefined1  [8])uVar64;
                  local_880.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_880);
                    uVar69 = CONCAT44(uStack_65c,local_660);
                    auVar205 = ZEXT1664(local_6c0._0_16_);
                    auVar203 = ZEXT3264(local_7c0);
                    auVar202 = ZEXT3264(local_740);
                    auVar204 = ZEXT3264(local_7a0);
                    auVar201 = ZEXT3264(local_780);
                    auVar200 = ZEXT3264(local_720);
                    auVar199 = ZEXT3264(local_760);
                    auVar198 = ZEXT3264(local_700);
                    auVar197 = ZEXT3264(local_6e0);
                    auVar88 = vxorps_avx512vl(auVar93,auVar93);
                    auVar196 = ZEXT1664(auVar88);
                    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar147 = ZEXT3264(auVar108);
                    auVar131 = vmovdqa64_avx512f(local_640);
                    auVar70 = local_680;
                    uVar180 = local_7e0._0_4_;
                  }
                  auVar88 = auVar196._0_16_;
                  uVar149 = vptestmd_avx512f(auVar131,auVar131);
                  if ((short)uVar149 != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_880);
                      uVar69 = CONCAT44(uStack_65c,local_660);
                      auVar205 = ZEXT1664(local_6c0._0_16_);
                      auVar203 = ZEXT3264(local_7c0);
                      auVar202 = ZEXT3264(local_740);
                      auVar204 = ZEXT3264(local_7a0);
                      auVar201 = ZEXT3264(local_780);
                      auVar200 = ZEXT3264(local_720);
                      auVar199 = ZEXT3264(local_760);
                      auVar198 = ZEXT3264(local_700);
                      auVar197 = ZEXT3264(local_6e0);
                      auVar88 = vxorps_avx512vl(auVar88,auVar88);
                      auVar196 = ZEXT1664(auVar88);
                      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar147 = ZEXT3264(auVar108);
                      auVar131 = vmovdqa64_avx512f(local_640);
                      auVar70 = local_680;
                      uVar180 = local_7e0._0_4_;
                    }
                    auVar88 = auVar205._0_16_;
                    uVar64 = vptestmd_avx512f(auVar131,auVar131);
                    auVar131 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar68 = (bool)((byte)uVar64 & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
                    bVar17 = (bool)((byte)(uVar64 >> 4) & 1);
                    bVar18 = (bool)((byte)(uVar64 >> 5) & 1);
                    bVar19 = (bool)((byte)(uVar64 >> 6) & 1);
                    bVar20 = (bool)((byte)(uVar64 >> 7) & 1);
                    bVar21 = (bool)((byte)(uVar64 >> 8) & 1);
                    bVar22 = (bool)((byte)(uVar64 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar64 >> 10) & 1);
                    bVar24 = (bool)((byte)(uVar64 >> 0xb) & 1);
                    bVar25 = (bool)((byte)(uVar64 >> 0xc) & 1);
                    bVar26 = (bool)((byte)(uVar64 >> 0xd) & 1);
                    bVar27 = (bool)((byte)(uVar64 >> 0xe) & 1);
                    bVar28 = SUB81(uVar64 >> 0xf,0);
                    *(uint *)(local_880.ray + 0x200) =
                         (uint)bVar68 * auVar131._0_4_ |
                         (uint)!bVar68 * *(int *)(local_880.ray + 0x200);
                    *(uint *)(local_880.ray + 0x204) =
                         (uint)bVar14 * auVar131._4_4_ |
                         (uint)!bVar14 * *(int *)(local_880.ray + 0x204);
                    *(uint *)(local_880.ray + 0x208) =
                         (uint)bVar15 * auVar131._8_4_ |
                         (uint)!bVar15 * *(int *)(local_880.ray + 0x208);
                    *(uint *)(local_880.ray + 0x20c) =
                         (uint)bVar16 * auVar131._12_4_ |
                         (uint)!bVar16 * *(int *)(local_880.ray + 0x20c);
                    *(uint *)(local_880.ray + 0x210) =
                         (uint)bVar17 * auVar131._16_4_ |
                         (uint)!bVar17 * *(int *)(local_880.ray + 0x210);
                    *(uint *)(local_880.ray + 0x214) =
                         (uint)bVar18 * auVar131._20_4_ |
                         (uint)!bVar18 * *(int *)(local_880.ray + 0x214);
                    *(uint *)(local_880.ray + 0x218) =
                         (uint)bVar19 * auVar131._24_4_ |
                         (uint)!bVar19 * *(int *)(local_880.ray + 0x218);
                    *(uint *)(local_880.ray + 0x21c) =
                         (uint)bVar20 * auVar131._28_4_ |
                         (uint)!bVar20 * *(int *)(local_880.ray + 0x21c);
                    *(uint *)(local_880.ray + 0x220) =
                         (uint)bVar21 * auVar131._32_4_ |
                         (uint)!bVar21 * *(int *)(local_880.ray + 0x220);
                    *(uint *)(local_880.ray + 0x224) =
                         (uint)bVar22 * auVar131._36_4_ |
                         (uint)!bVar22 * *(int *)(local_880.ray + 0x224);
                    *(uint *)(local_880.ray + 0x228) =
                         (uint)bVar23 * auVar131._40_4_ |
                         (uint)!bVar23 * *(int *)(local_880.ray + 0x228);
                    *(uint *)(local_880.ray + 0x22c) =
                         (uint)bVar24 * auVar131._44_4_ |
                         (uint)!bVar24 * *(int *)(local_880.ray + 0x22c);
                    *(uint *)(local_880.ray + 0x230) =
                         (uint)bVar25 * auVar131._48_4_ |
                         (uint)!bVar25 * *(int *)(local_880.ray + 0x230);
                    *(uint *)(local_880.ray + 0x234) =
                         (uint)bVar26 * auVar131._52_4_ |
                         (uint)!bVar26 * *(int *)(local_880.ray + 0x234);
                    *(uint *)(local_880.ray + 0x238) =
                         (uint)bVar27 * auVar131._56_4_ |
                         (uint)!bVar27 * *(int *)(local_880.ray + 0x238);
                    *(uint *)(local_880.ray + 0x23c) =
                         (uint)bVar28 * auVar131._60_4_ |
                         (uint)!bVar28 * *(int *)(local_880.ray + 0x23c);
                    if ((short)uVar64 != 0) {
                      bVar68 = true;
                      goto LAB_01927b8b;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar141;
                  uVar64 = 0;
                  uVar69 = uVar69 ^ 1L << ((ulong)auVar70 & 0x3f);
                  for (uVar67 = uVar69; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000
                      ) {
                    uVar64 = uVar64 + 1;
                  }
                }
              }
            }
          }
        }
        bVar68 = false;
      }
    }
LAB_01927b8b:
    if (8 < iVar8) {
      local_6c0 = vpbroadcastd_avx512vl();
      local_7e0 = vbroadcastss_avx512vl(auVar88);
      local_680._0_4_ = 1.0 / (float)local_480._0_4_;
      local_680._4_4_ = local_680._0_4_;
      fStack_678 = (float)local_680._0_4_;
      fStack_674 = (float)local_680._0_4_;
      fStack_670 = (float)local_680._0_4_;
      fStack_66c = (float)local_680._0_4_;
      fStack_668 = (float)local_680._0_4_;
      register0x0000121c = local_680._0_4_;
      auVar205 = vpbroadcastd_avx512f();
      local_480 = vmovdqa64_avx512f(auVar205);
      local_660 = uVar180;
      uStack_65c = uVar180;
      uStack_658 = uVar180;
      uStack_654 = uVar180;
      uStack_650 = uVar180;
      uStack_64c = uVar180;
      uStack_648 = uVar180;
      uStack_644 = uVar180;
      for (lVar72 = 8; lVar72 < iVar8; lVar72 = lVar72 + 8) {
        auVar108 = vpbroadcastd_avx512vl();
        auVar94 = vpor_avx2(auVar108,_DAT_01fb4ba0);
        uVar32 = vpcmpd_avx512vl(auVar94,local_6c0,1);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 * 4 + lVar65);
        auVar109 = *(undefined1 (*) [32])(lVar65 + 0x21fb768 + lVar72 * 4);
        auVar107 = *(undefined1 (*) [32])(lVar65 + 0x21fbbec + lVar72 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar65 + 0x21fc070 + lVar72 * 4);
        local_740 = auVar202._0_32_;
        auVar95 = vmulps_avx512vl(local_740,auVar106);
        auVar112 = auVar203._0_32_;
        auVar105 = vmulps_avx512vl(auVar112,auVar106);
        auVar44._4_4_ = auVar106._4_4_ * (float)local_3c0._4_4_;
        auVar44._0_4_ = auVar106._0_4_ * (float)local_3c0._0_4_;
        auVar44._8_4_ = auVar106._8_4_ * fStack_3b8;
        auVar44._12_4_ = auVar106._12_4_ * fStack_3b4;
        auVar44._16_4_ = auVar106._16_4_ * fStack_3b0;
        auVar44._20_4_ = auVar106._20_4_ * fStack_3ac;
        auVar44._24_4_ = auVar106._24_4_ * fStack_3a8;
        auVar44._28_4_ = auVar94._28_4_;
        auVar111 = auVar201._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar107,auVar111);
        auVar113 = auVar204._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar113);
        auVar105 = vfmadd231ps_avx512vl(auVar44,auVar107,local_3a0);
        auVar110 = auVar199._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar109,auVar110);
        local_720 = auVar200._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_720);
        auVar88 = vfmadd231ps_fma(auVar105,auVar109,local_380);
        local_6e0 = auVar197._0_32_;
        auVar98 = vfmadd231ps_avx512vl(auVar94,auVar108,local_6e0);
        local_700 = auVar198._0_32_;
        auVar99 = vfmadd231ps_avx512vl(auVar95,auVar108,local_700);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 * 4 + lVar65);
        auVar95 = *(undefined1 (*) [32])(lVar65 + 0x21fdb88 + lVar72 * 4);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar108,local_360);
        auVar105 = *(undefined1 (*) [32])(lVar65 + 0x21fe00c + lVar72 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar65 + 0x21fe490 + lVar72 * 4);
        auVar96 = vmulps_avx512vl(local_740,auVar104);
        auVar97 = vmulps_avx512vl(auVar112,auVar104);
        auVar45._4_4_ = auVar104._4_4_ * (float)local_3c0._4_4_;
        auVar45._0_4_ = auVar104._0_4_ * (float)local_3c0._0_4_;
        auVar45._8_4_ = auVar104._8_4_ * fStack_3b8;
        auVar45._12_4_ = auVar104._12_4_ * fStack_3b4;
        auVar45._16_4_ = auVar104._16_4_ * fStack_3b0;
        auVar45._20_4_ = auVar104._20_4_ * fStack_3ac;
        auVar45._24_4_ = auVar104._24_4_ * fStack_3a8;
        auVar45._28_4_ = uStack_3a4;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,auVar111);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar105,auVar113);
        auVar100 = vfmadd231ps_avx512vl(auVar45,auVar105,local_3a0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar110);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_720);
        auVar93 = vfmadd231ps_fma(auVar100,auVar95,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar96,auVar94,local_6e0);
        auVar101 = vfmadd231ps_avx512vl(auVar97,auVar94,local_700);
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar94,local_360);
        auVar102 = vmaxps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar93));
        auVar96 = vsubps_avx(auVar100,auVar98);
        auVar97 = vsubps_avx(auVar101,auVar99);
        auVar103 = vmulps_avx512vl(auVar99,auVar96);
        auVar120 = vmulps_avx512vl(auVar98,auVar97);
        auVar103 = vsubps_avx512vl(auVar103,auVar120);
        auVar120 = vmulps_avx512vl(auVar97,auVar97);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar96,auVar96);
        auVar102 = vmulps_avx512vl(auVar102,auVar102);
        auVar102 = vmulps_avx512vl(auVar102,auVar120);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        uVar149 = vcmpps_avx512vl(auVar103,auVar102,2);
        bVar73 = (byte)uVar32 & (byte)uVar149;
        if (bVar73 != 0) {
          auVar104 = vmulps_avx512vl(local_820,auVar104);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_420,auVar104);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_400,auVar105);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_3e0,auVar95);
          auVar106 = vmulps_avx512vl(local_820,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_420,auVar106);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_400,auVar107);
          auVar95 = vfmadd213ps_avx512vl(auVar108,local_3e0,auVar109);
          auVar108 = *(undefined1 (*) [32])(lVar65 + 0x21fc4f4 + lVar72 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar65 + 0x21fc978 + lVar72 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar65 + 0x21fcdfc + lVar72 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar65 + 0x21fd280 + lVar72 * 4);
          auVar105 = vmulps_avx512vl(local_740,auVar106);
          auVar104 = vmulps_avx512vl(auVar112,auVar106);
          auVar106 = vmulps_avx512vl(local_820,auVar106);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar111);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar113);
          auVar107 = vfmadd231ps_avx512vl(auVar106,local_420,auVar107);
          auVar106 = vfmadd231ps_avx512vl(auVar105,auVar109,auVar110);
          auVar105 = vfmadd231ps_avx512vl(auVar104,auVar109,local_720);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_400,auVar109);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_6e0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_700);
          auVar104 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar108);
          auVar108 = *(undefined1 (*) [32])(lVar65 + 0x21fe914 + lVar72 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar65 + 0x21ff21c + lVar72 * 4);
          auVar107 = *(undefined1 (*) [32])(lVar65 + 0x21ff6a0 + lVar72 * 4);
          auVar102 = vmulps_avx512vl(local_740,auVar107);
          auVar103 = vmulps_avx512vl(auVar112,auVar107);
          auVar107 = vmulps_avx512vl(local_820,auVar107);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,auVar111);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,auVar113);
          auVar107 = vfmadd231ps_avx512vl(auVar107,local_420,auVar109);
          auVar109 = *(undefined1 (*) [32])(lVar65 + 0x21fed98 + lVar72 * 4);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,auVar110);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_720);
          auVar109 = vfmadd231ps_avx512vl(auVar107,local_400,auVar109);
          auVar107 = vfmadd231ps_avx512vl(auVar102,auVar108,local_6e0);
          auVar102 = vfmadd231ps_avx512vl(auVar103,auVar108,local_700);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_3e0,auVar108);
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar106,auVar103);
          vandps_avx512vl(auVar105,auVar103);
          auVar108 = vmaxps_avx(auVar103,auVar103);
          vandps_avx512vl(auVar104,auVar103);
          auVar108 = vmaxps_avx(auVar108,auVar103);
          uVar64 = vcmpps_avx512vl(auVar108,local_7e0,1);
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar121._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar106._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar106._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar106._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar106._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar121._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar106._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar121._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar106._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar121._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar106._24_4_)
          ;
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar121._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar106._28_4_;
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar122._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar105._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar105._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar105._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar105._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar105._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar105._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar105._24_4_)
          ;
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar122._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar105._28_4_;
          vandps_avx512vl(auVar107,auVar103);
          vandps_avx512vl(auVar102,auVar103);
          auVar108 = vmaxps_avx(auVar122,auVar122);
          vandps_avx512vl(auVar109,auVar103);
          auVar108 = vmaxps_avx(auVar108,auVar122);
          uVar64 = vcmpps_avx512vl(auVar108,local_7e0,1);
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar123._0_4_ = (uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar107._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar107._4_4_;
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar107._8_4_;
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar107._12_4_;
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar107._16_4_;
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar107._20_4_;
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar107._24_4_;
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar123._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar107._28_4_;
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar124._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar102._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar102._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar102._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar102._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar124._16_4_ = (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar102._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar124._20_4_ = (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar102._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar124._24_4_ = (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar102._24_4_)
          ;
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar124._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar102._28_4_;
          auVar184._8_4_ = 0x80000000;
          auVar184._0_8_ = 0x8000000080000000;
          auVar184._12_4_ = 0x80000000;
          auVar184._16_4_ = 0x80000000;
          auVar184._20_4_ = 0x80000000;
          auVar184._24_4_ = 0x80000000;
          auVar184._28_4_ = 0x80000000;
          auVar108 = vxorps_avx512vl(auVar123,auVar184);
          auVar102 = auVar196._0_32_;
          auVar109 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar102);
          auVar90 = vfmadd231ps_fma(auVar109,auVar122,auVar122);
          auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
          auVar195._8_4_ = 0xbf000000;
          auVar195._0_8_ = 0xbf000000bf000000;
          auVar195._12_4_ = 0xbf000000;
          auVar195._16_4_ = 0xbf000000;
          auVar195._20_4_ = 0xbf000000;
          auVar195._24_4_ = 0xbf000000;
          auVar195._28_4_ = 0xbf000000;
          fVar160 = auVar109._0_4_;
          fVar179 = auVar109._4_4_;
          fVar182 = auVar109._8_4_;
          fVar148 = auVar109._12_4_;
          fVar175 = auVar109._16_4_;
          fVar174 = auVar109._20_4_;
          fVar177 = auVar109._24_4_;
          auVar46._4_4_ = fVar179 * fVar179 * fVar179 * auVar90._4_4_ * -0.5;
          auVar46._0_4_ = fVar160 * fVar160 * fVar160 * auVar90._0_4_ * -0.5;
          auVar46._8_4_ = fVar182 * fVar182 * fVar182 * auVar90._8_4_ * -0.5;
          auVar46._12_4_ = fVar148 * fVar148 * fVar148 * auVar90._12_4_ * -0.5;
          auVar46._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar46._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar46._24_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar46._28_4_ = auVar122._28_4_;
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar109 = vfmadd231ps_avx512vl(auVar46,auVar107,auVar109);
          auVar47._4_4_ = auVar122._4_4_ * auVar109._4_4_;
          auVar47._0_4_ = auVar122._0_4_ * auVar109._0_4_;
          auVar47._8_4_ = auVar122._8_4_ * auVar109._8_4_;
          auVar47._12_4_ = auVar122._12_4_ * auVar109._12_4_;
          auVar47._16_4_ = auVar122._16_4_ * auVar109._16_4_;
          auVar47._20_4_ = auVar122._20_4_ * auVar109._20_4_;
          auVar47._24_4_ = auVar122._24_4_ * auVar109._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar109._4_4_ * -auVar121._4_4_;
          auVar48._0_4_ = auVar109._0_4_ * -auVar121._0_4_;
          auVar48._8_4_ = auVar109._8_4_ * -auVar121._8_4_;
          auVar48._12_4_ = auVar109._12_4_ * -auVar121._12_4_;
          auVar48._16_4_ = auVar109._16_4_ * -auVar121._16_4_;
          auVar48._20_4_ = auVar109._20_4_ * -auVar121._20_4_;
          auVar48._24_4_ = auVar109._24_4_ * -auVar121._24_4_;
          auVar48._28_4_ = auVar122._28_4_;
          auVar106 = vmulps_avx512vl(auVar109,auVar102);
          auVar109 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar102);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar124,auVar124);
          auVar105 = vrsqrt14ps_avx512vl(auVar109);
          auVar109 = vmulps_avx512vl(auVar109,auVar195);
          fVar160 = auVar105._0_4_;
          fVar179 = auVar105._4_4_;
          fVar182 = auVar105._8_4_;
          fVar148 = auVar105._12_4_;
          fVar175 = auVar105._16_4_;
          fVar174 = auVar105._20_4_;
          fVar177 = auVar105._24_4_;
          auVar49._4_4_ = fVar179 * fVar179 * fVar179 * auVar109._4_4_;
          auVar49._0_4_ = fVar160 * fVar160 * fVar160 * auVar109._0_4_;
          auVar49._8_4_ = fVar182 * fVar182 * fVar182 * auVar109._8_4_;
          auVar49._12_4_ = fVar148 * fVar148 * fVar148 * auVar109._12_4_;
          auVar49._16_4_ = fVar175 * fVar175 * fVar175 * auVar109._16_4_;
          auVar49._20_4_ = fVar174 * fVar174 * fVar174 * auVar109._20_4_;
          auVar49._24_4_ = fVar177 * fVar177 * fVar177 * auVar109._24_4_;
          auVar49._28_4_ = auVar109._28_4_;
          auVar109 = vfmadd231ps_avx512vl(auVar49,auVar107,auVar105);
          auVar50._4_4_ = auVar124._4_4_ * auVar109._4_4_;
          auVar50._0_4_ = auVar124._0_4_ * auVar109._0_4_;
          auVar50._8_4_ = auVar124._8_4_ * auVar109._8_4_;
          auVar50._12_4_ = auVar124._12_4_ * auVar109._12_4_;
          auVar50._16_4_ = auVar124._16_4_ * auVar109._16_4_;
          auVar50._20_4_ = auVar124._20_4_ * auVar109._20_4_;
          auVar50._24_4_ = auVar124._24_4_ * auVar109._24_4_;
          auVar50._28_4_ = auVar105._28_4_;
          auVar51._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar51._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar51._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar51._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar51._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar51._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar51._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar51._28_4_ = auVar108._28_4_;
          auVar108 = vmulps_avx512vl(auVar109,auVar102);
          auVar90 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar88),auVar98);
          auVar109 = ZEXT1632(auVar88);
          auVar89 = vfmadd213ps_fma(auVar48,auVar109,auVar99);
          auVar107 = vfmadd213ps_avx512vl(auVar106,auVar109,auVar95);
          auVar105 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar93),auVar100);
          auVar81 = vfnmadd213ps_fma(auVar47,auVar109,auVar98);
          auVar104 = ZEXT1632(auVar93);
          auVar6 = vfmadd213ps_fma(auVar51,auVar104,auVar101);
          auVar82 = vfnmadd213ps_fma(auVar48,auVar109,auVar99);
          auVar29 = vfmadd213ps_fma(auVar108,auVar104,auVar94);
          auVar99 = ZEXT1632(auVar88);
          auVar86 = vfnmadd231ps_fma(auVar95,auVar99,auVar106);
          auVar83 = vfnmadd213ps_fma(auVar50,auVar104,auVar100);
          auVar85 = vfnmadd213ps_fma(auVar51,auVar104,auVar101);
          auVar87 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar93),auVar108);
          auVar94 = vsubps_avx512vl(auVar105,ZEXT1632(auVar81));
          auVar108 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar82));
          auVar109 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar86));
          auVar52._4_4_ = auVar108._4_4_ * auVar86._4_4_;
          auVar52._0_4_ = auVar108._0_4_ * auVar86._0_4_;
          auVar52._8_4_ = auVar108._8_4_ * auVar86._8_4_;
          auVar52._12_4_ = auVar108._12_4_ * auVar86._12_4_;
          auVar52._16_4_ = auVar108._16_4_ * 0.0;
          auVar52._20_4_ = auVar108._20_4_ * 0.0;
          auVar52._24_4_ = auVar108._24_4_ * 0.0;
          auVar52._28_4_ = auVar106._28_4_;
          auVar88 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar82),auVar109);
          auVar53._4_4_ = auVar109._4_4_ * auVar81._4_4_;
          auVar53._0_4_ = auVar109._0_4_ * auVar81._0_4_;
          auVar53._8_4_ = auVar109._8_4_ * auVar81._8_4_;
          auVar53._12_4_ = auVar109._12_4_ * auVar81._12_4_;
          auVar53._16_4_ = auVar109._16_4_ * 0.0;
          auVar53._20_4_ = auVar109._20_4_ * 0.0;
          auVar53._24_4_ = auVar109._24_4_ * 0.0;
          auVar53._28_4_ = auVar109._28_4_;
          auVar84 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar86),auVar94);
          auVar54._4_4_ = auVar82._4_4_ * auVar94._4_4_;
          auVar54._0_4_ = auVar82._0_4_ * auVar94._0_4_;
          auVar54._8_4_ = auVar82._8_4_ * auVar94._8_4_;
          auVar54._12_4_ = auVar82._12_4_ * auVar94._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * 0.0;
          auVar54._20_4_ = auVar94._20_4_ * 0.0;
          auVar54._24_4_ = auVar94._24_4_ * 0.0;
          auVar54._28_4_ = auVar94._28_4_;
          auVar80 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar81),auVar108);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar102,ZEXT1632(auVar84));
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar88));
          uVar64 = vcmpps_avx512vl(auVar108,auVar102,2);
          bVar63 = (byte)uVar64;
          fVar133 = (float)((uint)(bVar63 & 1) * auVar90._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar135 = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar83._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar137 = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar83._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar139 = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar83._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar133))));
          fVar134 = (float)((uint)(bVar63 & 1) * auVar89._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar85._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar136 = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar85._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar138 = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar85._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar140 = (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar85._12_4_);
          auVar96 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar134))));
          auVar125._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar107._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar87._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar87._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar87._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar87._12_4_)
          ;
          fVar160 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar107._16_4_);
          auVar125._16_4_ = fVar160;
          fVar182 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar107._20_4_);
          auVar125._20_4_ = fVar182;
          fVar179 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar107._24_4_);
          auVar125._24_4_ = fVar179;
          iVar1 = (uint)(byte)(uVar64 >> 7) * auVar107._28_4_;
          auVar125._28_4_ = iVar1;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar105);
          auVar126._0_4_ =
               (uint)(bVar63 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar88._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar88._4_4_;
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar88._8_4_;
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar88._12_4_;
          auVar126._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_;
          auVar126._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_;
          auVar126._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_;
          auVar126._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar6));
          auVar127._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar90._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar90._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar90._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar127._12_4_ = (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar90._12_4_)
          ;
          fVar174 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_);
          auVar127._16_4_ = fVar174;
          fVar148 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_);
          auVar127._20_4_ = fVar148;
          fVar175 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_);
          auVar127._24_4_ = fVar175;
          auVar127._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
          auVar108 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar29));
          auVar128._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar108._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar89._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar14 * auVar108._4_4_ | (uint)!bVar14 * auVar89._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar14 * auVar108._8_4_ | (uint)!bVar14 * auVar89._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar14 * auVar108._12_4_ | (uint)!bVar14 * auVar89._12_4_)
          ;
          fVar177 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_);
          auVar128._16_4_ = fVar177;
          fVar74 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_);
          auVar128._20_4_ = fVar74;
          fVar75 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_);
          auVar128._24_4_ = fVar75;
          iVar2 = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
          auVar128._28_4_ = iVar2;
          auVar129._0_4_ =
               (uint)(bVar63 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar105._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar14 * (int)auVar81._4_4_ | (uint)!bVar14 * auVar105._4_4_;
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar14 * (int)auVar81._8_4_ | (uint)!bVar14 * auVar105._8_4_;
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar14 * (int)auVar81._12_4_ | (uint)!bVar14 * auVar105._12_4_;
          auVar129._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar105._16_4_;
          auVar129._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar105._20_4_;
          auVar129._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar105._24_4_;
          auVar129._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar105._28_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar129,auVar104);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar82._12_4_ |
                                                   (uint)!bVar18 * auVar6._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar82._8_4_ |
                                                            (uint)!bVar16 * auVar6._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar82._4_4_ |
                                                                     (uint)!bVar14 * auVar6._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar82._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar6._0_4_)))),auVar96);
          auVar107 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar86._12_4_ |
                                                   (uint)!bVar19 * auVar29._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar86._8_4_ |
                                                            (uint)!bVar17 * auVar29._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar86._4_4_ |
                                                                     (uint)!bVar15 * auVar29._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar86._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar29._0_4_)))),auVar125);
          auVar106 = vsubps_avx(auVar104,auVar126);
          auVar94 = vsubps_avx(auVar96,auVar127);
          auVar95 = vsubps_avx(auVar125,auVar128);
          auVar55._4_4_ = auVar107._4_4_ * fVar135;
          auVar55._0_4_ = auVar107._0_4_ * fVar133;
          auVar55._8_4_ = auVar107._8_4_ * fVar137;
          auVar55._12_4_ = auVar107._12_4_ * fVar139;
          auVar55._16_4_ = auVar107._16_4_ * 0.0;
          auVar55._20_4_ = auVar107._20_4_ * 0.0;
          auVar55._24_4_ = auVar107._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar55,auVar125,auVar105);
          auVar164._0_4_ = fVar134 * auVar105._0_4_;
          auVar164._4_4_ = fVar136 * auVar105._4_4_;
          auVar164._8_4_ = fVar138 * auVar105._8_4_;
          auVar164._12_4_ = fVar140 * auVar105._12_4_;
          auVar164._16_4_ = auVar105._16_4_ * 0.0;
          auVar164._20_4_ = auVar105._20_4_ * 0.0;
          auVar164._24_4_ = auVar105._24_4_ * 0.0;
          auVar164._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar164,auVar104,auVar109);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar102,ZEXT1632(auVar88));
          auVar168._0_4_ = auVar109._0_4_ * auVar125._0_4_;
          auVar168._4_4_ = auVar109._4_4_ * auVar125._4_4_;
          auVar168._8_4_ = auVar109._8_4_ * auVar125._8_4_;
          auVar168._12_4_ = auVar109._12_4_ * auVar125._12_4_;
          auVar168._16_4_ = auVar109._16_4_ * fVar160;
          auVar168._20_4_ = auVar109._20_4_ * fVar182;
          auVar168._24_4_ = auVar109._24_4_ * fVar179;
          auVar168._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar168,auVar96,auVar107);
          auVar97 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar88));
          auVar108 = vmulps_avx512vl(auVar95,auVar126);
          auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar128);
          auVar56._4_4_ = auVar94._4_4_ * auVar128._4_4_;
          auVar56._0_4_ = auVar94._0_4_ * auVar128._0_4_;
          auVar56._8_4_ = auVar94._8_4_ * auVar128._8_4_;
          auVar56._12_4_ = auVar94._12_4_ * auVar128._12_4_;
          auVar56._16_4_ = auVar94._16_4_ * fVar177;
          auVar56._20_4_ = auVar94._20_4_ * fVar74;
          auVar56._24_4_ = auVar94._24_4_ * fVar75;
          auVar56._28_4_ = iVar2;
          auVar88 = vfmsub231ps_fma(auVar56,auVar127,auVar95);
          auVar169._0_4_ = auVar127._0_4_ * auVar106._0_4_;
          auVar169._4_4_ = auVar127._4_4_ * auVar106._4_4_;
          auVar169._8_4_ = auVar127._8_4_ * auVar106._8_4_;
          auVar169._12_4_ = auVar127._12_4_ * auVar106._12_4_;
          auVar169._16_4_ = fVar174 * auVar106._16_4_;
          auVar169._20_4_ = fVar148 * auVar106._20_4_;
          auVar169._24_4_ = fVar175 * auVar106._24_4_;
          auVar169._28_4_ = 0;
          auVar90 = vfmsub231ps_fma(auVar169,auVar94,auVar126);
          auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar102,auVar108);
          auVar98 = vfmadd231ps_avx512vl(auVar108,auVar102,ZEXT1632(auVar88));
          auVar108 = vmaxps_avx(auVar97,auVar98);
          uVar149 = vcmpps_avx512vl(auVar108,auVar102,2);
          bVar73 = bVar73 & (byte)uVar149;
          if (bVar73 != 0) {
            auVar57._4_4_ = auVar95._4_4_ * auVar109._4_4_;
            auVar57._0_4_ = auVar95._0_4_ * auVar109._0_4_;
            auVar57._8_4_ = auVar95._8_4_ * auVar109._8_4_;
            auVar57._12_4_ = auVar95._12_4_ * auVar109._12_4_;
            auVar57._16_4_ = auVar95._16_4_ * auVar109._16_4_;
            auVar57._20_4_ = auVar95._20_4_ * auVar109._20_4_;
            auVar57._24_4_ = auVar95._24_4_ * auVar109._24_4_;
            auVar57._28_4_ = auVar108._28_4_;
            auVar89 = vfmsub231ps_fma(auVar57,auVar94,auVar107);
            auVar58._4_4_ = auVar107._4_4_ * auVar106._4_4_;
            auVar58._0_4_ = auVar107._0_4_ * auVar106._0_4_;
            auVar58._8_4_ = auVar107._8_4_ * auVar106._8_4_;
            auVar58._12_4_ = auVar107._12_4_ * auVar106._12_4_;
            auVar58._16_4_ = auVar107._16_4_ * auVar106._16_4_;
            auVar58._20_4_ = auVar107._20_4_ * auVar106._20_4_;
            auVar58._24_4_ = auVar107._24_4_ * auVar106._24_4_;
            auVar58._28_4_ = auVar107._28_4_;
            auVar90 = vfmsub231ps_fma(auVar58,auVar105,auVar95);
            auVar59._4_4_ = auVar94._4_4_ * auVar105._4_4_;
            auVar59._0_4_ = auVar94._0_4_ * auVar105._0_4_;
            auVar59._8_4_ = auVar94._8_4_ * auVar105._8_4_;
            auVar59._12_4_ = auVar94._12_4_ * auVar105._12_4_;
            auVar59._16_4_ = auVar94._16_4_ * auVar105._16_4_;
            auVar59._20_4_ = auVar94._20_4_ * auVar105._20_4_;
            auVar59._24_4_ = auVar94._24_4_ * auVar105._24_4_;
            auVar59._28_4_ = auVar94._28_4_;
            auVar6 = vfmsub231ps_fma(auVar59,auVar106,auVar109);
            auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar6));
            auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar89),auVar102);
            auVar109 = vrcp14ps_avx512vl(auVar108);
            auVar106 = auVar147._0_32_;
            auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar106);
            auVar88 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
            auVar60._4_4_ = auVar6._4_4_ * auVar125._4_4_;
            auVar60._0_4_ = auVar6._0_4_ * auVar125._0_4_;
            auVar60._8_4_ = auVar6._8_4_ * auVar125._8_4_;
            auVar60._12_4_ = auVar6._12_4_ * auVar125._12_4_;
            auVar60._16_4_ = fVar160 * 0.0;
            auVar60._20_4_ = fVar182 * 0.0;
            auVar60._24_4_ = fVar179 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar90 = vfmadd231ps_fma(auVar60,auVar96,ZEXT1632(auVar90));
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar104,ZEXT1632(auVar89));
            fVar160 = auVar88._0_4_;
            fVar179 = auVar88._4_4_;
            fVar182 = auVar88._8_4_;
            fVar148 = auVar88._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar148,
                                           CONCAT48(auVar90._8_4_ * fVar182,
                                                    CONCAT44(auVar90._4_4_ * fVar179,
                                                             auVar90._0_4_ * fVar160))));
            auVar62._4_4_ = uStack_65c;
            auVar62._0_4_ = local_660;
            auVar62._8_4_ = uStack_658;
            auVar62._12_4_ = uStack_654;
            auVar62._16_4_ = uStack_650;
            auVar62._20_4_ = uStack_64c;
            auVar62._24_4_ = uStack_648;
            auVar62._28_4_ = uStack_644;
            uVar149 = vcmpps_avx512vl(local_5a0,auVar62,0xd);
            uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar36._4_4_ = uVar141;
            auVar36._0_4_ = uVar141;
            auVar36._8_4_ = uVar141;
            auVar36._12_4_ = uVar141;
            auVar36._16_4_ = uVar141;
            auVar36._20_4_ = uVar141;
            auVar36._24_4_ = uVar141;
            auVar36._28_4_ = uVar141;
            uVar32 = vcmpps_avx512vl(local_5a0,auVar36,2);
            bVar73 = (byte)uVar149 & (byte)uVar32 & bVar73;
            if (bVar73 != 0) {
              uVar149 = vcmpps_avx512vl(auVar108,auVar102,4);
              bVar73 = bVar73 & (byte)uVar149;
              if (bVar73 != 0) {
                fVar175 = auVar97._0_4_ * fVar160;
                fVar174 = auVar97._4_4_ * fVar179;
                auVar61._4_4_ = fVar174;
                auVar61._0_4_ = fVar175;
                fVar177 = auVar97._8_4_ * fVar182;
                auVar61._8_4_ = fVar177;
                fVar74 = auVar97._12_4_ * fVar148;
                auVar61._12_4_ = fVar74;
                fVar75 = auVar97._16_4_ * 0.0;
                auVar61._16_4_ = fVar75;
                fVar133 = auVar97._20_4_ * 0.0;
                auVar61._20_4_ = fVar133;
                fVar134 = auVar97._24_4_ * 0.0;
                auVar61._24_4_ = fVar134;
                auVar61._28_4_ = auVar108._28_4_;
                auVar109 = vsubps_avx512vl(auVar106,auVar61);
                local_5e0._0_4_ =
                     (float)((uint)(bVar63 & 1) * (int)fVar175 |
                            (uint)!(bool)(bVar63 & 1) * auVar109._0_4_);
                bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar14 * (int)fVar174 | (uint)!bVar14 * auVar109._4_4_);
                bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar14 * (int)fVar177 | (uint)!bVar14 * auVar109._8_4_);
                bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar14 * (int)fVar74 | (uint)!bVar14 * auVar109._12_4_);
                bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar109._16_4_);
                bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar14 * (int)fVar133 | (uint)!bVar14 * auVar109._20_4_);
                bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar14 * (int)fVar134 | (uint)!bVar14 * auVar109._24_4_);
                bVar14 = SUB81(uVar64 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar14 * auVar108._28_4_ | (uint)!bVar14 * auVar109._28_4_);
                auVar108 = vsubps_avx(ZEXT1632(auVar93),auVar99);
                auVar88 = vfmadd213ps_fma(auVar108,local_5e0,auVar99);
                uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar37._4_4_ = uVar141;
                auVar37._0_4_ = uVar141;
                auVar37._8_4_ = uVar141;
                auVar37._12_4_ = uVar141;
                auVar37._16_4_ = uVar141;
                auVar37._20_4_ = uVar141;
                auVar37._24_4_ = uVar141;
                auVar37._28_4_ = uVar141;
                auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                              CONCAT48(auVar88._8_4_ + auVar88._8_4_
                                                                       ,CONCAT44(auVar88._4_4_ +
                                                                                 auVar88._4_4_,
                                                                                 auVar88._0_4_ +
                                                                                 auVar88._0_4_)))),
                                           auVar37);
                uVar149 = vcmpps_avx512vl(local_5a0,auVar108,6);
                if (((byte)uVar149 & bVar73) != 0) {
                  auVar155._0_4_ = auVar98._0_4_ * fVar160;
                  auVar155._4_4_ = auVar98._4_4_ * fVar179;
                  auVar155._8_4_ = auVar98._8_4_ * fVar182;
                  auVar155._12_4_ = auVar98._12_4_ * fVar148;
                  auVar155._16_4_ = auVar98._16_4_ * 0.0;
                  auVar155._20_4_ = auVar98._20_4_ * 0.0;
                  auVar155._24_4_ = auVar98._24_4_ * 0.0;
                  auVar155._28_4_ = 0;
                  auVar108 = vsubps_avx512vl(auVar106,auVar155);
                  auVar130._0_4_ =
                       (uint)(bVar63 & 1) * (int)auVar155._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar108._0_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                  auVar130._4_4_ =
                       (uint)bVar14 * (int)auVar155._4_4_ | (uint)!bVar14 * auVar108._4_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                  auVar130._8_4_ =
                       (uint)bVar14 * (int)auVar155._8_4_ | (uint)!bVar14 * auVar108._8_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                  auVar130._12_4_ =
                       (uint)bVar14 * (int)auVar155._12_4_ | (uint)!bVar14 * auVar108._12_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                  auVar130._16_4_ =
                       (uint)bVar14 * (int)auVar155._16_4_ | (uint)!bVar14 * auVar108._16_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
                  auVar130._20_4_ =
                       (uint)bVar14 * (int)auVar155._20_4_ | (uint)!bVar14 * auVar108._20_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
                  auVar130._24_4_ =
                       (uint)bVar14 * (int)auVar155._24_4_ | (uint)!bVar14 * auVar108._24_4_;
                  auVar130._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar108._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar130,auVar106,auVar38);
                  local_580 = (undefined4)lVar72;
                  local_570 = local_830._0_8_;
                  uStack_568 = local_830._8_8_;
                  local_560 = local_840._0_8_;
                  uStack_558 = local_840._8_8_;
                  local_550 = local_850._0_8_;
                  uStack_548 = local_850._8_8_;
                  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar63 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar63 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar88 = vcvtsi2ss_avx512f(auVar103._0_16_,local_580);
                    fVar160 = auVar88._0_4_;
                    local_520[0] = (fVar160 + local_5e0._0_4_ + 0.0) * (float)local_680._0_4_;
                    local_520[1] = (fVar160 + local_5e0._4_4_ + 1.0) * (float)local_680._4_4_;
                    local_520[2] = (fVar160 + local_5e0._8_4_ + 2.0) * fStack_678;
                    local_520[3] = (fVar160 + local_5e0._12_4_ + 3.0) * fStack_674;
                    fStack_510 = (fVar160 + local_5e0._16_4_ + 4.0) * fStack_670;
                    fStack_50c = (fVar160 + local_5e0._20_4_ + 5.0) * fStack_66c;
                    fStack_508 = (fVar160 + local_5e0._24_4_ + 6.0) * fStack_668;
                    fStack_504 = fVar160 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    uVar64 = 0;
                    uVar69 = (ulong)((byte)uVar149 & bVar73);
                    for (uVar67 = uVar69; local_57c = iVar8, (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      uVar64 = uVar64 + 1;
                    }
                    while (auVar88 = auVar196._0_16_, uVar69 != 0) {
                      uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar64]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar64 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar64 * 4)
                      ;
                      local_880.context = context->user;
                      fVar148 = local_200._0_4_;
                      fVar179 = 1.0 - fVar148;
                      fVar160 = fVar179 * fVar179 * -3.0;
                      auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                                ZEXT416((uint)(fVar148 * fVar179)),
                                                ZEXT416(0xc0000000));
                      auVar93 = vfmsub132ss_fma(ZEXT416((uint)(fVar148 * fVar179)),
                                                ZEXT416((uint)(fVar148 * fVar148)),
                                                ZEXT416(0x40000000));
                      fVar179 = auVar88._0_4_ * 3.0;
                      fVar182 = auVar93._0_4_ * 3.0;
                      fVar148 = fVar148 * fVar148 * 3.0;
                      auVar173._0_4_ = fVar148 * (float)local_690._0_4_;
                      auVar173._4_4_ = fVar148 * (float)local_690._4_4_;
                      auVar173._8_4_ = fVar148 * fStack_688;
                      auVar173._12_4_ = fVar148 * fStack_684;
                      auVar145._4_4_ = fVar182;
                      auVar145._0_4_ = fVar182;
                      auVar145._8_4_ = fVar182;
                      auVar145._12_4_ = fVar182;
                      auVar88 = vfmadd132ps_fma(auVar145,auVar173,local_850);
                      auVar162._4_4_ = fVar179;
                      auVar162._0_4_ = fVar179;
                      auVar162._8_4_ = fVar179;
                      auVar162._12_4_ = fVar179;
                      auVar88 = vfmadd132ps_fma(auVar162,auVar88,local_840);
                      auVar146._4_4_ = fVar160;
                      auVar146._0_4_ = fVar160;
                      auVar146._8_4_ = fVar160;
                      auVar146._12_4_ = fVar160;
                      auVar88 = vfmadd132ps_fma(auVar146,auVar88,local_830);
                      auVar147 = vbroadcastss_avx512f(auVar88);
                      auVar197 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar197,ZEXT1664(auVar88));
                      auVar197 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar197,ZEXT1664(auVar88));
                      local_2c0[0] = (RTCHitN)auVar147[0];
                      local_2c0[1] = (RTCHitN)auVar147[1];
                      local_2c0[2] = (RTCHitN)auVar147[2];
                      local_2c0[3] = (RTCHitN)auVar147[3];
                      local_2c0[4] = (RTCHitN)auVar147[4];
                      local_2c0[5] = (RTCHitN)auVar147[5];
                      local_2c0[6] = (RTCHitN)auVar147[6];
                      local_2c0[7] = (RTCHitN)auVar147[7];
                      local_2c0[8] = (RTCHitN)auVar147[8];
                      local_2c0[9] = (RTCHitN)auVar147[9];
                      local_2c0[10] = (RTCHitN)auVar147[10];
                      local_2c0[0xb] = (RTCHitN)auVar147[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar147[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar147[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar147[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar147[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar147[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar147[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar147[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar147[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar147[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar147[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar147[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar147[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar147[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar147[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar147[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar147[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar147[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar147[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar147[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar147[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar147[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar147[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar147[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar147[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar147[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar147[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar147[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar147[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar147[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar147[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar147[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar147[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar147[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar147[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar147[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar147[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar147[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar147[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar147[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar147[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar147[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar147[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar147[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar147[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar147[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar147[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar147[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar147[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar147[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar147[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar147[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar147[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar147 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar147);
                      vpcmpeqd_avx2(auVar147._0_32_,auVar147._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instPrimID[0]));
                      auVar147 = vmovdqa64_avx512f(local_340);
                      local_640 = vmovdqa64_avx512f(auVar147);
                      local_880.valid = (int *)local_640;
                      local_880.geometryUserPtr = pGVar9->userPtr;
                      local_880.hit = local_2c0;
                      local_880.N = 0x10;
                      local_4c0._0_8_ = uVar64;
                      uVar67 = uVar64;
                      local_880.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_880);
                        auVar147 = vmovdqa64_avx512f(local_640);
                        uVar67 = local_4c0._0_8_;
                      }
                      uVar149 = vptestmd_avx512f(auVar147,auVar147);
                      if ((short)uVar149 != 0) {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_880);
                          auVar147 = vmovdqa64_avx512f(local_640);
                          uVar67 = local_4c0._0_8_;
                        }
                        auVar88 = auVar196._0_16_;
                        uVar64 = vptestmd_avx512f(auVar147,auVar147);
                        auVar197 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar14 = (bool)((byte)uVar64 & 1);
                        auVar147._0_4_ =
                             (uint)bVar14 * auVar197._0_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x200);
                        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                        auVar147._4_4_ =
                             (uint)bVar14 * auVar197._4_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x204);
                        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                        auVar147._8_4_ =
                             (uint)bVar14 * auVar197._8_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x208);
                        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                        auVar147._12_4_ =
                             (uint)bVar14 * auVar197._12_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x20c);
                        bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                        auVar147._16_4_ =
                             (uint)bVar14 * auVar197._16_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x210);
                        bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
                        auVar147._20_4_ =
                             (uint)bVar14 * auVar197._20_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x214);
                        bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
                        auVar147._24_4_ =
                             (uint)bVar14 * auVar197._24_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x218);
                        bVar14 = (bool)((byte)(uVar64 >> 7) & 1);
                        auVar147._28_4_ =
                             (uint)bVar14 * auVar197._28_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x21c);
                        bVar14 = (bool)((byte)(uVar64 >> 8) & 1);
                        auVar147._32_4_ =
                             (uint)bVar14 * auVar197._32_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x220);
                        bVar14 = (bool)((byte)(uVar64 >> 9) & 1);
                        auVar147._36_4_ =
                             (uint)bVar14 * auVar197._36_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x224);
                        bVar14 = (bool)((byte)(uVar64 >> 10) & 1);
                        auVar147._40_4_ =
                             (uint)bVar14 * auVar197._40_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x228);
                        bVar14 = (bool)((byte)(uVar64 >> 0xb) & 1);
                        auVar147._44_4_ =
                             (uint)bVar14 * auVar197._44_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x22c);
                        bVar14 = (bool)((byte)(uVar64 >> 0xc) & 1);
                        auVar147._48_4_ =
                             (uint)bVar14 * auVar197._48_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x230);
                        bVar14 = (bool)((byte)(uVar64 >> 0xd) & 1);
                        auVar147._52_4_ =
                             (uint)bVar14 * auVar197._52_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x234);
                        bVar14 = (bool)((byte)(uVar64 >> 0xe) & 1);
                        auVar147._56_4_ =
                             (uint)bVar14 * auVar197._56_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x238);
                        bVar14 = SUB81(uVar64 >> 0xf,0);
                        auVar147._60_4_ =
                             (uint)bVar14 * auVar197._60_4_ |
                             (uint)!bVar14 * *(int *)(local_880.ray + 0x23c);
                        *(undefined1 (*) [64])(local_880.ray + 0x200) = auVar147;
                        if ((short)uVar64 != 0) {
                          bVar63 = 1;
                          goto LAB_019285e6;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar141;
                      uVar64 = 0;
                      uVar69 = uVar69 ^ 1L << (uVar67 & 0x3f);
                      for (uVar67 = uVar69; (uVar67 & 1) == 0;
                          uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        uVar64 = uVar64 + 1;
                      }
                    }
                    bVar63 = 0;
LAB_019285e6:
                    auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar147 = ZEXT3264(auVar108);
                    auVar88 = vxorps_avx512vl(auVar88,auVar88);
                    auVar196 = ZEXT1664(auVar88);
                    auVar197 = ZEXT3264(local_6e0);
                    auVar198 = ZEXT3264(local_700);
                    auVar199 = ZEXT3264(local_760);
                    auVar200 = ZEXT3264(local_720);
                    auVar201 = ZEXT3264(local_780);
                    auVar204 = ZEXT3264(local_7a0);
                    auVar202 = ZEXT3264(local_740);
                    auVar203 = ZEXT3264(local_7c0);
                  }
                  bVar68 = (bool)(bVar68 | bVar63);
                }
              }
            }
          }
        }
      }
    }
    if (bVar68) break;
    uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar33._4_4_ = uVar141;
    auVar33._0_4_ = uVar141;
    auVar33._8_4_ = uVar141;
    auVar33._12_4_ = uVar141;
    uVar149 = vcmpps_avx512vl(local_5f0,auVar33,2);
  }
  return uVar71 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }